

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersectorK<4,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  long lVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  ulong uVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  byte bVar64;
  uint uVar65;
  long lVar66;
  ulong uVar67;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar68;
  long lVar69;
  uint uVar70;
  ulong uVar71;
  byte bVar72;
  undefined4 uVar73;
  ulong uVar74;
  bool bVar75;
  float fVar76;
  float fVar102;
  float fVar104;
  vint4 bi_1;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar77;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  float fVar106;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  float fVar103;
  float fVar105;
  float fVar107;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar84 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  float fVar111;
  float fVar139;
  float fVar140;
  vint4 bi_2;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar141;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar161;
  vint4 ai;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar164;
  float fVar166;
  float fVar168;
  undefined1 auVar152 [32];
  float fVar162;
  float fVar169;
  undefined1 auVar153 [32];
  float fVar163;
  float fVar165;
  float fVar167;
  float fVar170;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  float fVar171;
  float fVar191;
  float fVar192;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar199;
  float fVar216;
  float fVar217;
  vint4 bi;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [28];
  float fVar218;
  float fVar221;
  undefined1 auVar208 [32];
  float fVar222;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar219;
  float fVar220;
  undefined1 auVar215 [64];
  float fVar223;
  float fVar244;
  float fVar246;
  vint4 ai_2;
  float fVar248;
  undefined1 auVar225 [16];
  float fVar224;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [28];
  float fVar250;
  float fVar251;
  undefined1 auVar234 [32];
  float fVar245;
  float fVar247;
  float fVar249;
  float fVar252;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar266;
  float fVar269;
  vint4 ai_1;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [28];
  float fVar267;
  float fVar270;
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar284;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar268;
  float fVar271;
  float fVar274;
  float fVar277;
  float fVar280;
  float fVar283;
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar287 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  float fVar294;
  float fVar299;
  float fVar300;
  undefined1 auVar295 [16];
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar307;
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  float fVar315;
  float fVar316;
  undefined1 auVar310 [64];
  float fVar317;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar318 [32];
  float fVar325;
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  float fVar329;
  float fVar334;
  float fVar335;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  float fVar341;
  float fVar342;
  float fVar347;
  float fVar349;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar357;
  float fVar358;
  float fVar359;
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar360 [16];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [64];
  undefined1 auVar365 [28];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d2c;
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  float fStack_c84;
  undefined1 local_be0 [16];
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_bb0 [8];
  float fStack_ba8;
  float fStack_ba4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined1 local_b90 [8];
  float fStack_b88;
  float fStack_b84;
  undefined1 local_b80 [32];
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined1 local_b20 [32];
  undefined1 (*local_af0) [16];
  undefined1 (*local_ae8) [16];
  undefined1 (*local_ae0) [32];
  ulong local_ad8;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_950 [16];
  Primitive *local_940;
  Primitive *local_938;
  ulong local_930;
  ulong local_928;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [16];
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined4 uStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar1 = prim[1];
  uVar71 = (ulong)(byte)PVar1;
  local_940 = prim + uVar71 * 0x19 + 0x16;
  fVar294 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar115 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar115 = vinsertps_avx(auVar115,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar115 = vsubps_avx(auVar115,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar112._0_4_ = fVar294 * auVar115._0_4_;
  auVar112._4_4_ = fVar294 * auVar115._4_4_;
  auVar112._8_4_ = fVar294 * auVar115._8_4_;
  auVar112._12_4_ = fVar294 * auVar115._12_4_;
  auVar285._0_4_ = fVar294 * auVar6._0_4_;
  auVar285._4_4_ = fVar294 * auVar6._4_4_;
  auVar285._8_4_ = fVar294 * auVar6._8_4_;
  auVar285._12_4_ = fVar294 * auVar6._12_4_;
  auVar115 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar226 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xc + 6)));
  auVar226 = vcvtdq2ps_avx(auVar226);
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xd + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar79 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x12 + 6)));
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar82 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x13 + 6)));
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x14 + 6)));
  auVar114 = vcvtdq2ps_avx(auVar114);
  auVar78 = vshufps_avx(auVar285,auVar285,0);
  auVar113 = vshufps_avx(auVar285,auVar285,0x55);
  auVar142 = vshufps_avx(auVar285,auVar285,0xaa);
  fVar294 = auVar142._0_4_;
  fVar223 = auVar142._4_4_;
  fVar171 = auVar142._8_4_;
  fVar299 = auVar142._12_4_;
  fVar192 = auVar113._0_4_;
  fVar301 = auVar113._4_4_;
  fVar248 = auVar113._8_4_;
  fVar193 = auVar113._12_4_;
  fVar244 = auVar78._0_4_;
  fVar191 = auVar78._4_4_;
  fVar300 = auVar78._8_4_;
  fVar246 = auVar78._12_4_;
  auVar330._0_4_ = fVar244 * auVar115._0_4_ + fVar192 * auVar6._0_4_ + fVar294 * auVar9._0_4_;
  auVar330._4_4_ = fVar191 * auVar115._4_4_ + fVar301 * auVar6._4_4_ + fVar223 * auVar9._4_4_;
  auVar330._8_4_ = fVar300 * auVar115._8_4_ + fVar248 * auVar6._8_4_ + fVar171 * auVar9._8_4_;
  auVar330._12_4_ = fVar246 * auVar115._12_4_ + fVar193 * auVar6._12_4_ + fVar299 * auVar9._12_4_;
  auVar343._0_4_ = fVar244 * auVar10._0_4_ + fVar192 * auVar226._0_4_ + auVar145._0_4_ * fVar294;
  auVar343._4_4_ = fVar191 * auVar10._4_4_ + fVar301 * auVar226._4_4_ + auVar145._4_4_ * fVar223;
  auVar343._8_4_ = fVar300 * auVar10._8_4_ + fVar248 * auVar226._8_4_ + auVar145._8_4_ * fVar171;
  auVar343._12_4_ = fVar246 * auVar10._12_4_ + fVar193 * auVar226._12_4_ + auVar145._12_4_ * fVar299
  ;
  auVar286._0_4_ = fVar244 * auVar79._0_4_ + fVar192 * auVar82._0_4_ + auVar114._0_4_ * fVar294;
  auVar286._4_4_ = fVar191 * auVar79._4_4_ + fVar301 * auVar82._4_4_ + auVar114._4_4_ * fVar223;
  auVar286._8_4_ = fVar300 * auVar79._8_4_ + fVar248 * auVar82._8_4_ + auVar114._8_4_ * fVar171;
  auVar286._12_4_ = fVar246 * auVar79._12_4_ + fVar193 * auVar82._12_4_ + auVar114._12_4_ * fVar299;
  auVar78 = vshufps_avx(auVar112,auVar112,0);
  auVar113 = vshufps_avx(auVar112,auVar112,0x55);
  auVar142 = vshufps_avx(auVar112,auVar112,0xaa);
  fVar294 = auVar142._0_4_;
  fVar223 = auVar142._4_4_;
  fVar171 = auVar142._8_4_;
  fVar299 = auVar142._12_4_;
  fVar192 = auVar113._0_4_;
  fVar301 = auVar113._4_4_;
  fVar248 = auVar113._8_4_;
  fVar193 = auVar113._12_4_;
  fVar244 = auVar78._0_4_;
  fVar191 = auVar78._4_4_;
  fVar300 = auVar78._8_4_;
  fVar246 = auVar78._12_4_;
  auVar256._0_4_ = fVar244 * auVar115._0_4_ + fVar192 * auVar6._0_4_ + fVar294 * auVar9._0_4_;
  auVar256._4_4_ = fVar191 * auVar115._4_4_ + fVar301 * auVar6._4_4_ + fVar223 * auVar9._4_4_;
  auVar256._8_4_ = fVar300 * auVar115._8_4_ + fVar248 * auVar6._8_4_ + fVar171 * auVar9._8_4_;
  auVar256._12_4_ = fVar246 * auVar115._12_4_ + fVar193 * auVar6._12_4_ + fVar299 * auVar9._12_4_;
  auVar78._0_4_ = fVar244 * auVar10._0_4_ + auVar145._0_4_ * fVar294 + fVar192 * auVar226._0_4_;
  auVar78._4_4_ = fVar191 * auVar10._4_4_ + auVar145._4_4_ * fVar223 + fVar301 * auVar226._4_4_;
  auVar78._8_4_ = fVar300 * auVar10._8_4_ + auVar145._8_4_ * fVar171 + fVar248 * auVar226._8_4_;
  auVar78._12_4_ = fVar246 * auVar10._12_4_ + auVar145._12_4_ * fVar299 + fVar193 * auVar226._12_4_;
  auVar295._8_4_ = 0x7fffffff;
  auVar295._0_8_ = 0x7fffffff7fffffff;
  auVar295._12_4_ = 0x7fffffff;
  auVar115 = vandps_avx(auVar330,auVar295);
  auVar200._8_4_ = 0x219392ef;
  auVar200._0_8_ = 0x219392ef219392ef;
  auVar200._12_4_ = 0x219392ef;
  auVar115 = vcmpps_avx(auVar115,auVar200,1);
  auVar6 = vblendvps_avx(auVar330,auVar200,auVar115);
  auVar115 = vandps_avx(auVar343,auVar295);
  auVar115 = vcmpps_avx(auVar115,auVar200,1);
  auVar9 = vblendvps_avx(auVar343,auVar200,auVar115);
  auVar115 = vandps_avx(auVar295,auVar286);
  auVar115 = vcmpps_avx(auVar115,auVar200,1);
  auVar115 = vblendvps_avx(auVar286,auVar200,auVar115);
  auVar113._0_4_ = fVar244 * auVar79._0_4_ + fVar192 * auVar82._0_4_ + auVar114._0_4_ * fVar294;
  auVar113._4_4_ = fVar191 * auVar79._4_4_ + fVar301 * auVar82._4_4_ + auVar114._4_4_ * fVar223;
  auVar113._8_4_ = fVar300 * auVar79._8_4_ + fVar248 * auVar82._8_4_ + auVar114._8_4_ * fVar171;
  auVar113._12_4_ = fVar246 * auVar79._12_4_ + fVar193 * auVar82._12_4_ + auVar114._12_4_ * fVar299;
  auVar10 = vrcpps_avx(auVar6);
  fVar294 = auVar10._0_4_;
  auVar172._0_4_ = fVar294 * auVar6._0_4_;
  fVar299 = auVar10._4_4_;
  auVar172._4_4_ = fVar299 * auVar6._4_4_;
  fVar300 = auVar10._8_4_;
  auVar172._8_4_ = fVar300 * auVar6._8_4_;
  fVar301 = auVar10._12_4_;
  auVar172._12_4_ = fVar301 * auVar6._12_4_;
  auVar287._8_4_ = 0x3f800000;
  auVar287._0_8_ = 0x3f8000003f800000;
  auVar287._12_4_ = 0x3f800000;
  auVar6 = vsubps_avx(auVar287,auVar172);
  fVar294 = fVar294 + fVar294 * auVar6._0_4_;
  fVar299 = fVar299 + fVar299 * auVar6._4_4_;
  fVar300 = fVar300 + fVar300 * auVar6._8_4_;
  fVar301 = fVar301 + fVar301 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar9);
  fVar223 = auVar6._0_4_;
  auVar173._0_4_ = fVar223 * auVar9._0_4_;
  fVar244 = auVar6._4_4_;
  auVar173._4_4_ = fVar244 * auVar9._4_4_;
  fVar246 = auVar6._8_4_;
  auVar173._8_4_ = fVar246 * auVar9._8_4_;
  fVar248 = auVar6._12_4_;
  auVar173._12_4_ = fVar248 * auVar9._12_4_;
  auVar6 = vsubps_avx(auVar287,auVar173);
  fVar223 = fVar223 + fVar223 * auVar6._0_4_;
  fVar244 = fVar244 + fVar244 * auVar6._4_4_;
  fVar246 = fVar246 + fVar246 * auVar6._8_4_;
  fVar248 = fVar248 + fVar248 * auVar6._12_4_;
  auVar6 = vrcpps_avx(auVar115);
  fVar171 = auVar6._0_4_;
  auVar174._0_4_ = fVar171 * auVar115._0_4_;
  fVar191 = auVar6._4_4_;
  auVar174._4_4_ = fVar191 * auVar115._4_4_;
  fVar192 = auVar6._8_4_;
  auVar174._8_4_ = fVar192 * auVar115._8_4_;
  fVar193 = auVar6._12_4_;
  auVar174._12_4_ = fVar193 * auVar115._12_4_;
  auVar115 = vsubps_avx(auVar287,auVar174);
  fVar171 = fVar171 + fVar171 * auVar115._0_4_;
  fVar191 = fVar191 + fVar191 * auVar115._4_4_;
  fVar192 = fVar192 + fVar192 * auVar115._8_4_;
  fVar193 = fVar193 + fVar193 * auVar115._12_4_;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar115 = vpmovsxwd_avx(auVar115);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar256);
  auVar142._0_4_ = fVar294 * auVar115._0_4_;
  auVar142._4_4_ = fVar299 * auVar115._4_4_;
  auVar142._8_4_ = fVar300 * auVar115._8_4_;
  auVar142._12_4_ = fVar301 * auVar115._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar115 = vpmovsxwd_avx(auVar6);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar256);
  auVar201._0_4_ = fVar294 * auVar115._0_4_;
  auVar201._4_4_ = fVar299 * auVar115._4_4_;
  auVar201._8_4_ = fVar300 * auVar115._8_4_;
  auVar201._12_4_ = fVar301 * auVar115._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar71 * 0xe + 6);
  auVar115 = vpmovsxwd_avx(auVar9);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar78);
  auVar257._0_4_ = auVar115._0_4_ * fVar223;
  auVar257._4_4_ = auVar115._4_4_ * fVar244;
  auVar257._8_4_ = auVar115._8_4_ * fVar246;
  auVar257._12_4_ = auVar115._12_4_ * fVar248;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar115 = vpmovsxwd_avx(auVar10);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar78);
  auVar79._0_4_ = fVar223 * auVar115._0_4_;
  auVar79._4_4_ = fVar244 * auVar115._4_4_;
  auVar79._8_4_ = fVar246 * auVar115._8_4_;
  auVar79._12_4_ = fVar248 * auVar115._12_4_;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = *(ulong *)(prim + uVar71 * 0x15 + 6);
  auVar115 = vpmovsxwd_avx(auVar226);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar113);
  auVar225._0_4_ = auVar115._0_4_ * fVar171;
  auVar225._4_4_ = auVar115._4_4_ * fVar191;
  auVar225._8_4_ = auVar115._8_4_ * fVar192;
  auVar225._12_4_ = auVar115._12_4_ * fVar193;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar115 = vpmovsxwd_avx(auVar145);
  auVar115 = vcvtdq2ps_avx(auVar115);
  auVar115 = vsubps_avx(auVar115,auVar113);
  auVar114._0_4_ = auVar115._0_4_ * fVar171;
  auVar114._4_4_ = auVar115._4_4_ * fVar191;
  auVar114._8_4_ = auVar115._8_4_ * fVar192;
  auVar114._12_4_ = auVar115._12_4_ * fVar193;
  auVar115 = vpminsd_avx(auVar142,auVar201);
  auVar6 = vpminsd_avx(auVar257,auVar79);
  auVar115 = vmaxps_avx(auVar115,auVar6);
  auVar6 = vpminsd_avx(auVar225,auVar114);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar304._4_4_ = uVar73;
  auVar304._0_4_ = uVar73;
  auVar304._8_4_ = uVar73;
  auVar304._12_4_ = uVar73;
  auVar6 = vmaxps_avx(auVar6,auVar304);
  auVar115 = vmaxps_avx(auVar115,auVar6);
  local_780._0_4_ = auVar115._0_4_ * 0.99999964;
  local_780._4_4_ = auVar115._4_4_ * 0.99999964;
  local_780._8_4_ = auVar115._8_4_ * 0.99999964;
  local_780._12_4_ = auVar115._12_4_ * 0.99999964;
  auVar115 = vpmaxsd_avx(auVar142,auVar201);
  auVar6 = vpmaxsd_avx(auVar257,auVar79);
  auVar115 = vminps_avx(auVar115,auVar6);
  auVar6 = vpmaxsd_avx(auVar225,auVar114);
  uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar84._4_4_ = uVar73;
  auVar84._0_4_ = uVar73;
  auVar84._8_4_ = uVar73;
  auVar84._12_4_ = uVar73;
  auVar6 = vminps_avx(auVar6,auVar84);
  auVar115 = vminps_avx(auVar115,auVar6);
  auVar82._0_4_ = auVar115._0_4_ * 1.0000004;
  auVar82._4_4_ = auVar115._4_4_ * 1.0000004;
  auVar82._8_4_ = auVar115._8_4_ * 1.0000004;
  auVar82._12_4_ = auVar115._12_4_ * 1.0000004;
  auVar115 = vpshufd_avx(ZEXT116((byte)PVar1),0);
  auVar6 = vpcmpgtd_avx(auVar115,_DAT_01f4ad30);
  auVar115 = vcmpps_avx(local_780,auVar82,2);
  auVar115 = vandps_avx(auVar115,auVar6);
  uVar73 = vmovmskps_avx(auVar115);
  local_928 = CONCAT44((int)((ulong)ray >> 0x20),uVar73);
  auVar88._16_16_ = mm_lookupmask_ps._240_16_;
  auVar88._0_16_ = mm_lookupmask_ps._240_16_;
  local_540 = vblendps_avx(auVar88,ZEXT832(0) << 0x20,0x80);
  local_ae0 = (undefined1 (*) [32])&local_680;
  uVar70 = 1 << ((byte)k & 0x1f);
  local_ae8 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar70 & 0xf) << 4));
  local_af0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar70 >> 4) * 0x10);
  local_938 = prim;
LAB_00789f00:
  if (local_928 == 0) {
LAB_0078c97a:
    return local_928 != 0;
  }
  lVar66 = 0;
  if (local_928 != 0) {
    for (; (local_928 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
    }
  }
  local_930 = local_928 - 1 & local_928;
  lVar69 = lVar66 * 0x40;
  lVar5 = 0;
  if (local_930 != 0) {
    for (; (local_930 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  local_ad8 = (ulong)*(uint *)(local_938 + 2);
  auVar115 = *(undefined1 (*) [16])(local_940 + lVar69);
  if (((local_930 != 0) && (uVar71 = local_930 - 1 & local_930, uVar71 != 0)) &&
     (lVar5 = 0, uVar71 != 0)) {
    for (; (uVar71 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
    }
  }
  auVar6 = *(undefined1 (*) [16])(local_940 + lVar69 + 0x10);
  auVar9 = *(undefined1 (*) [16])(local_940 + lVar69 + 0x20);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar145 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar294 = *(float *)(ray + k * 4 + 0x80);
  auVar331._4_4_ = fVar294;
  auVar331._0_4_ = fVar294;
  auVar331._8_4_ = fVar294;
  auVar331._12_4_ = fVar294;
  fStack_810 = fVar294;
  _local_820 = auVar331;
  fStack_80c = fVar294;
  fStack_808 = fVar294;
  fStack_804 = fVar294;
  auVar10 = *(undefined1 (*) [16])(local_940 + lVar69 + 0x30);
  fVar223 = *(float *)(ray + k * 4 + 0xa0);
  auVar344._4_4_ = fVar223;
  auVar344._0_4_ = fVar223;
  auVar344._8_4_ = fVar223;
  auVar344._12_4_ = fVar223;
  fStack_830 = fVar223;
  _local_840 = auVar344;
  fStack_82c = fVar223;
  fStack_828 = fVar223;
  fStack_824 = fVar223;
  auVar226 = vunpcklps_avx(auVar331,auVar344);
  fVar171 = *(float *)(ray + k * 4 + 0xc0);
  auVar360._4_4_ = fVar171;
  auVar360._0_4_ = fVar171;
  auVar360._8_4_ = fVar171;
  auVar360._12_4_ = fVar171;
  fStack_8f0 = fVar171;
  _local_900 = auVar360;
  fStack_8ec = fVar171;
  fStack_8e8 = fVar171;
  fStack_8e4 = fVar171;
  _local_a10 = vinsertps_avx(auVar226,auVar360,0x28);
  auVar80._0_4_ = (auVar115._0_4_ + auVar6._0_4_ + auVar9._0_4_ + auVar10._0_4_) * 0.25;
  auVar80._4_4_ = (auVar115._4_4_ + auVar6._4_4_ + auVar9._4_4_ + auVar10._4_4_) * 0.25;
  auVar80._8_4_ = (auVar115._8_4_ + auVar6._8_4_ + auVar9._8_4_ + auVar10._8_4_) * 0.25;
  auVar80._12_4_ = (auVar115._12_4_ + auVar6._12_4_ + auVar9._12_4_ + auVar10._12_4_) * 0.25;
  auVar226 = vsubps_avx(auVar80,auVar145);
  auVar226 = vdpps_avx(auVar226,_local_a10,0x7f);
  local_a20 = vdpps_avx(_local_a10,_local_a10,0x7f);
  auVar79 = vrcpss_avx(local_a20,local_a20);
  fVar299 = auVar226._0_4_ * auVar79._0_4_ * (2.0 - local_a20._0_4_ * auVar79._0_4_);
  auVar79 = vshufps_avx(ZEXT416((uint)fVar299),ZEXT416((uint)fVar299),0);
  auVar202._0_4_ = auVar145._0_4_ + local_a10._0_4_ * auVar79._0_4_;
  auVar202._4_4_ = auVar145._4_4_ + local_a10._4_4_ * auVar79._4_4_;
  auVar202._8_4_ = auVar145._8_4_ + local_a10._8_4_ * auVar79._8_4_;
  auVar202._12_4_ = auVar145._12_4_ + local_a10._12_4_ * auVar79._12_4_;
  auVar226 = vblendps_avx(auVar202,_DAT_01f45a50,8);
  _local_b90 = vsubps_avx(auVar115,auVar226);
  _local_ba0 = vsubps_avx(auVar9,auVar226);
  _local_bb0 = vsubps_avx(auVar6,auVar226);
  _local_bc0 = vsubps_avx(auVar10,auVar226);
  auVar115 = vshufps_avx(_local_b90,_local_b90,0);
  register0x00001250 = auVar115;
  _local_1e0 = auVar115;
  auVar115 = vshufps_avx(_local_b90,_local_b90,0x55);
  local_a40._16_16_ = auVar115;
  local_a40._0_16_ = auVar115;
  auVar6 = vshufps_avx(_local_b90,_local_b90,0xaa);
  auVar9 = vshufps_avx(_local_b90,_local_b90,0xff);
  auVar115 = vshufps_avx(_local_bb0,_local_bb0,0);
  local_380._16_16_ = auVar115;
  local_380._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_bb0,_local_bb0,0x55);
  local_8c0._16_16_ = auVar115;
  local_8c0._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_bb0,_local_bb0,0xaa);
  auVar362._16_16_ = auVar115;
  auVar362._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_bb0,_local_bb0,0xff);
  local_3a0._16_16_ = auVar115;
  local_3a0._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_ba0,_local_ba0,0);
  local_3c0._16_16_ = auVar115;
  local_3c0._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_ba0,_local_ba0,0x55);
  local_3e0._16_16_ = auVar115;
  local_3e0._0_16_ = auVar115;
  auVar115 = vshufps_avx(_local_ba0,_local_ba0,0xaa);
  register0x00001290 = auVar115;
  _local_200 = auVar115;
  auVar115 = vshufps_avx(_local_ba0,_local_ba0,0xff);
  register0x00001290 = auVar115;
  _local_220 = auVar115;
  auVar115 = vshufps_avx(_local_bc0,_local_bc0,0);
  register0x00001290 = auVar115;
  _local_240 = auVar115;
  auVar115 = vshufps_avx(_local_bc0,_local_bc0,0x55);
  register0x00001290 = auVar115;
  _local_260 = auVar115;
  auVar115 = vshufps_avx(_local_bc0,_local_bc0,0xaa);
  register0x00001290 = auVar115;
  _local_280 = auVar115;
  auVar115 = vshufps_avx(_local_bc0,_local_bc0,0xff);
  auVar215 = ZEXT3264(local_8c0);
  register0x00001290 = auVar115;
  _local_2a0 = auVar115;
  auVar115 = ZEXT416((uint)(fVar294 * fVar294 + fVar223 * fVar223 + fVar171 * fVar171));
  auVar115 = vshufps_avx(auVar115,auVar115,0);
  local_2c0._16_16_ = auVar115;
  local_2c0._0_16_ = auVar115;
  fVar294 = *(float *)(ray + k * 4 + 0x60);
  local_950 = ZEXT416((uint)fVar299);
  auVar115 = vshufps_avx(ZEXT416((uint)(fVar294 - fVar299)),ZEXT416((uint)(fVar294 - fVar299)),0);
  local_400._16_16_ = auVar115;
  local_400._0_16_ = auVar115;
  auVar115 = vpshufd_avx(ZEXT416(*(uint *)(local_938 + 2)),0);
  local_5e0._16_16_ = auVar115;
  local_5e0._0_16_ = auVar115;
  auVar115 = vpshufd_avx(ZEXT416(*(uint *)(local_938 + lVar66 * 4 + 6)),0);
  local_600._16_16_ = auVar115;
  local_600._0_16_ = auVar115;
  register0x00001210 = auVar79;
  _local_920 = auVar79;
  uVar71 = 0;
  bVar72 = 0;
  local_d2c = 1;
  auVar89._8_4_ = 0x7fffffff;
  auVar89._0_8_ = 0x7fffffff7fffffff;
  auVar89._12_4_ = 0x7fffffff;
  auVar89._16_4_ = 0x7fffffff;
  auVar89._20_4_ = 0x7fffffff;
  auVar89._24_4_ = 0x7fffffff;
  auVar89._28_4_ = 0x7fffffff;
  local_5c0 = vandps_avx(local_2c0,auVar89);
  auVar115 = vsqrtss_avx(local_a20,local_a20);
  auVar10 = vsqrtss_avx(local_a20,local_a20);
  auVar310 = ZEXT3264(local_a40);
  local_770 = ZEXT816(0x3f80000000000000);
  local_9a0 = auVar362;
  do {
    auVar234._8_4_ = 0x3f800000;
    auVar234._0_8_ = 0x3f8000003f800000;
    auVar234._12_4_ = 0x3f800000;
    auVar234._16_4_ = 0x3f800000;
    auVar234._20_4_ = 0x3f800000;
    auVar234._24_4_ = 0x3f800000;
    auVar234._28_4_ = 0x3f800000;
    auVar226 = vmovshdup_avx(local_770);
    auVar79 = vsubps_avx(auVar226,local_770);
    auVar226 = vshufps_avx(local_770,local_770,0);
    local_880._16_16_ = auVar226;
    local_880._0_16_ = auVar226;
    auVar145 = vshufps_avx(auVar79,auVar79,0);
    fVar111 = auVar145._0_4_;
    fVar139 = auVar145._4_4_;
    fVar140 = auVar145._8_4_;
    fVar141 = auVar145._12_4_;
    fVar76 = auVar226._0_4_;
    auVar127._0_4_ = fVar76 + fVar111 * 0.0;
    fVar102 = auVar226._4_4_;
    auVar127._4_4_ = fVar102 + fVar139 * 0.14285715;
    fVar104 = auVar226._8_4_;
    auVar127._8_4_ = fVar104 + fVar140 * 0.2857143;
    fVar106 = auVar226._12_4_;
    auVar127._12_4_ = fVar106 + fVar141 * 0.42857146;
    auVar127._16_4_ = fVar76 + fVar111 * 0.5714286;
    auVar127._20_4_ = fVar102 + fVar139 * 0.71428573;
    auVar127._24_4_ = fVar104 + fVar140 * 0.8571429;
    auVar127._28_4_ = fVar106 + fVar141;
    auVar88 = vsubps_avx(auVar234,auVar127);
    fVar171 = auVar88._0_4_;
    fVar299 = auVar88._4_4_;
    fVar244 = auVar88._8_4_;
    fVar191 = auVar88._12_4_;
    fVar300 = auVar88._16_4_;
    fVar246 = auVar88._20_4_;
    fVar192 = auVar88._24_4_;
    fVar223 = local_3a0._28_4_;
    fVar198 = fVar223 + 1.0;
    fVar168 = auVar215._28_4_;
    fVar324 = auVar6._12_4_;
    fVar253 = local_3c0._0_4_ * auVar127._0_4_ + local_380._0_4_ * fVar171;
    fVar266 = local_3c0._4_4_ * auVar127._4_4_ + local_380._4_4_ * fVar299;
    fVar269 = local_3c0._8_4_ * auVar127._8_4_ + local_380._8_4_ * fVar244;
    fVar272 = local_3c0._12_4_ * auVar127._12_4_ + local_380._12_4_ * fVar191;
    fVar275 = local_3c0._16_4_ * auVar127._16_4_ + local_380._16_4_ * fVar300;
    fVar278 = local_3c0._20_4_ * auVar127._20_4_ + local_380._20_4_ * fVar246;
    fVar281 = local_3c0._24_4_ * auVar127._24_4_ + local_380._24_4_ * fVar192;
    fVar301 = local_3e0._0_4_ * auVar127._0_4_ + auVar215._0_4_ * fVar171;
    fVar248 = local_3e0._4_4_ * auVar127._4_4_ + auVar215._4_4_ * fVar299;
    fVar193 = local_3e0._8_4_ * auVar127._8_4_ + auVar215._8_4_ * fVar244;
    fVar194 = local_3e0._12_4_ * auVar127._12_4_ + auVar215._12_4_ * fVar191;
    fVar195 = local_3e0._16_4_ * auVar127._16_4_ + auVar215._16_4_ * fVar300;
    fVar196 = local_3e0._20_4_ * auVar127._20_4_ + auVar215._20_4_ * fVar246;
    fVar197 = local_3e0._24_4_ * auVar127._24_4_ + auVar215._24_4_ * fVar192;
    fVar199 = (float)local_200._0_4_ * auVar127._0_4_ + auVar362._0_4_ * fVar171;
    fVar216 = (float)local_200._4_4_ * auVar127._4_4_ + auVar362._4_4_ * fVar299;
    fVar217 = fStack_1f8 * auVar127._8_4_ + auVar362._8_4_ * fVar244;
    fVar218 = fStack_1f4 * auVar127._12_4_ + auVar362._12_4_ * fVar191;
    fVar219 = fStack_1f0 * auVar127._16_4_ + auVar362._16_4_ * fVar300;
    fVar220 = fStack_1ec * auVar127._20_4_ + auVar362._20_4_ * fVar246;
    fVar221 = fStack_1e8 * auVar127._24_4_ + auVar362._24_4_ * fVar192;
    fVar224 = (float)local_220._0_4_ * auVar127._0_4_ + local_3a0._0_4_ * fVar171;
    fVar245 = (float)local_220._4_4_ * auVar127._4_4_ + local_3a0._4_4_ * fVar299;
    fVar247 = fStack_218 * auVar127._8_4_ + local_3a0._8_4_ * fVar244;
    fVar249 = fStack_214 * auVar127._12_4_ + local_3a0._12_4_ * fVar191;
    fVar250 = fStack_210 * auVar127._16_4_ + local_3a0._16_4_ * fVar300;
    fVar251 = fStack_20c * auVar127._20_4_ + local_3a0._20_4_ * fVar246;
    fVar252 = fStack_208 * auVar127._24_4_ + local_3a0._24_4_ * fVar192;
    fVar359 = fVar324 + local_380._28_4_;
    fVar340 = fVar324 + fVar223;
    auVar296._0_4_ =
         fVar171 * (local_380._0_4_ * auVar127._0_4_ + fVar171 * (float)local_1e0._0_4_) +
         auVar127._0_4_ * fVar253;
    auVar296._4_4_ =
         fVar299 * (local_380._4_4_ * auVar127._4_4_ + fVar299 * (float)local_1e0._4_4_) +
         auVar127._4_4_ * fVar266;
    auVar296._8_4_ =
         fVar244 * (local_380._8_4_ * auVar127._8_4_ + fVar244 * fStack_1d8) +
         auVar127._8_4_ * fVar269;
    auVar296._12_4_ =
         fVar191 * (local_380._12_4_ * auVar127._12_4_ + fVar191 * fStack_1d4) +
         auVar127._12_4_ * fVar272;
    auVar296._16_4_ =
         fVar300 * (local_380._16_4_ * auVar127._16_4_ + fVar300 * fStack_1d0) +
         auVar127._16_4_ * fVar275;
    auVar296._20_4_ =
         fVar246 * (local_380._20_4_ * auVar127._20_4_ + fVar246 * fStack_1cc) +
         auVar127._20_4_ * fVar278;
    auVar296._24_4_ =
         fVar192 * (local_380._24_4_ * auVar127._24_4_ + fVar192 * fStack_1c8) +
         auVar127._24_4_ * fVar281;
    auVar296._28_4_ = local_3c0._28_4_ + fVar324;
    auVar308._0_4_ =
         (auVar215._0_4_ * auVar127._0_4_ + auVar310._0_4_ * fVar171) * fVar171 +
         auVar127._0_4_ * fVar301;
    auVar308._4_4_ =
         (auVar215._4_4_ * auVar127._4_4_ + auVar310._4_4_ * fVar299) * fVar299 +
         auVar127._4_4_ * fVar248;
    auVar308._8_4_ =
         (auVar215._8_4_ * auVar127._8_4_ + auVar310._8_4_ * fVar244) * fVar244 +
         auVar127._8_4_ * fVar193;
    auVar308._12_4_ =
         (auVar215._12_4_ * auVar127._12_4_ + auVar310._12_4_ * fVar191) * fVar191 +
         auVar127._12_4_ * fVar194;
    auVar308._16_4_ =
         (auVar215._16_4_ * auVar127._16_4_ + auVar310._16_4_ * fVar300) * fVar300 +
         auVar127._16_4_ * fVar195;
    auVar308._20_4_ =
         (auVar215._20_4_ * auVar127._20_4_ + auVar310._20_4_ * fVar246) * fVar246 +
         auVar127._20_4_ * fVar196;
    auVar308._24_4_ =
         (auVar215._24_4_ * auVar127._24_4_ + auVar310._24_4_ * fVar192) * fVar192 +
         auVar127._24_4_ * fVar197;
    auVar308._28_4_ = fVar168 + fVar198 + fVar324;
    auVar318._0_4_ =
         fVar171 * (auVar362._0_4_ * auVar127._0_4_ + auVar6._0_4_ * fVar171) +
         auVar127._0_4_ * fVar199;
    auVar318._4_4_ =
         fVar299 * (auVar362._4_4_ * auVar127._4_4_ + auVar6._4_4_ * fVar299) +
         auVar127._4_4_ * fVar216;
    auVar318._8_4_ =
         fVar244 * (auVar362._8_4_ * auVar127._8_4_ + auVar6._8_4_ * fVar244) +
         auVar127._8_4_ * fVar217;
    auVar318._12_4_ =
         fVar191 * (auVar362._12_4_ * auVar127._12_4_ + fVar324 * fVar191) +
         auVar127._12_4_ * fVar218;
    auVar318._16_4_ =
         fVar300 * (auVar362._16_4_ * auVar127._16_4_ + auVar6._0_4_ * fVar300) +
         auVar127._16_4_ * fVar219;
    auVar318._20_4_ =
         fVar246 * (auVar362._20_4_ * auVar127._20_4_ + auVar6._4_4_ * fVar246) +
         auVar127._20_4_ * fVar220;
    auVar318._24_4_ =
         fVar192 * (auVar362._24_4_ * auVar127._24_4_ + auVar6._8_4_ * fVar192) +
         auVar127._24_4_ * fVar221;
    auVar318._28_4_ = fStack_204 + fVar324;
    auVar290._0_4_ =
         auVar127._0_4_ * fVar224 +
         fVar171 * (local_3a0._0_4_ * auVar127._0_4_ + auVar9._0_4_ * fVar171);
    auVar290._4_4_ =
         auVar127._4_4_ * fVar245 +
         fVar299 * (local_3a0._4_4_ * auVar127._4_4_ + auVar9._4_4_ * fVar299);
    auVar290._8_4_ =
         auVar127._8_4_ * fVar247 +
         fVar244 * (local_3a0._8_4_ * auVar127._8_4_ + auVar9._8_4_ * fVar244);
    auVar290._12_4_ =
         auVar127._12_4_ * fVar249 +
         fVar191 * (local_3a0._12_4_ * auVar127._12_4_ + auVar9._12_4_ * fVar191);
    auVar290._16_4_ =
         auVar127._16_4_ * fVar250 +
         fVar300 * (local_3a0._16_4_ * auVar127._16_4_ + auVar9._0_4_ * fVar300);
    auVar290._20_4_ =
         auVar127._20_4_ * fVar251 +
         fVar246 * (local_3a0._20_4_ * auVar127._20_4_ + auVar9._4_4_ * fVar246);
    auVar290._24_4_ =
         auVar127._24_4_ * fVar252 +
         fVar192 * (local_3a0._24_4_ * auVar127._24_4_ + auVar9._8_4_ * fVar192);
    auVar290._28_4_ = fStack_204 + fVar223;
    auVar90._0_4_ =
         (auVar127._0_4_ * (float)local_240._0_4_ + local_3c0._0_4_ * fVar171) * auVar127._0_4_ +
         fVar171 * fVar253;
    auVar90._4_4_ =
         (auVar127._4_4_ * (float)local_240._4_4_ + local_3c0._4_4_ * fVar299) * auVar127._4_4_ +
         fVar299 * fVar266;
    auVar90._8_4_ =
         (auVar127._8_4_ * fStack_238 + local_3c0._8_4_ * fVar244) * auVar127._8_4_ +
         fVar244 * fVar269;
    auVar90._12_4_ =
         (auVar127._12_4_ * fStack_234 + local_3c0._12_4_ * fVar191) * auVar127._12_4_ +
         fVar191 * fVar272;
    auVar90._16_4_ =
         (auVar127._16_4_ * fStack_230 + local_3c0._16_4_ * fVar300) * auVar127._16_4_ +
         fVar300 * fVar275;
    auVar90._20_4_ =
         (auVar127._20_4_ * fStack_22c + local_3c0._20_4_ * fVar246) * auVar127._20_4_ +
         fVar246 * fVar278;
    auVar90._24_4_ =
         (auVar127._24_4_ * fStack_228 + local_3c0._24_4_ * fVar192) * auVar127._24_4_ +
         fVar192 * fVar281;
    auVar90._28_4_ = fStack_204 + fVar198 + local_380._28_4_;
    auVar187._0_4_ =
         (local_3e0._0_4_ * fVar171 + auVar127._0_4_ * (float)local_260._0_4_) * auVar127._0_4_ +
         fVar171 * fVar301;
    auVar187._4_4_ =
         (local_3e0._4_4_ * fVar299 + auVar127._4_4_ * (float)local_260._4_4_) * auVar127._4_4_ +
         fVar299 * fVar248;
    auVar187._8_4_ =
         (local_3e0._8_4_ * fVar244 + auVar127._8_4_ * fStack_258) * auVar127._8_4_ +
         fVar244 * fVar193;
    auVar187._12_4_ =
         (local_3e0._12_4_ * fVar191 + auVar127._12_4_ * fStack_254) * auVar127._12_4_ +
         fVar191 * fVar194;
    auVar187._16_4_ =
         (local_3e0._16_4_ * fVar300 + auVar127._16_4_ * fStack_250) * auVar127._16_4_ +
         fVar300 * fVar195;
    auVar187._20_4_ =
         (local_3e0._20_4_ * fVar246 + auVar127._20_4_ * fStack_24c) * auVar127._20_4_ +
         fVar246 * fVar196;
    auVar187._24_4_ =
         (local_3e0._24_4_ * fVar192 + auVar127._24_4_ * fStack_248) * auVar127._24_4_ +
         fVar192 * fVar197;
    auVar187._28_4_ = fStack_204 + fVar168 + fVar198;
    auVar208._0_4_ =
         (auVar127._0_4_ * (float)local_280._0_4_ + (float)local_200._0_4_ * fVar171) *
         auVar127._0_4_ + fVar171 * fVar199;
    auVar208._4_4_ =
         (auVar127._4_4_ * (float)local_280._4_4_ + (float)local_200._4_4_ * fVar299) *
         auVar127._4_4_ + fVar299 * fVar216;
    auVar208._8_4_ =
         (auVar127._8_4_ * fStack_278 + fStack_1f8 * fVar244) * auVar127._8_4_ + fVar244 * fVar217;
    auVar208._12_4_ =
         (auVar127._12_4_ * fStack_274 + fStack_1f4 * fVar191) * auVar127._12_4_ + fVar191 * fVar218
    ;
    auVar208._16_4_ =
         (auVar127._16_4_ * fStack_270 + fStack_1f0 * fVar300) * auVar127._16_4_ + fVar300 * fVar219
    ;
    auVar208._20_4_ =
         (auVar127._20_4_ * fStack_26c + fStack_1ec * fVar246) * auVar127._20_4_ + fVar246 * fVar220
    ;
    auVar208._24_4_ =
         (auVar127._24_4_ * fStack_268 + fStack_1e8 * fVar192) * auVar127._24_4_ + fVar192 * fVar221
    ;
    auVar208._28_4_ = fVar340 + fVar223 + fVar168;
    auVar235._0_4_ =
         (auVar127._0_4_ * (float)local_2a0._0_4_ + (float)local_220._0_4_ * fVar171) *
         auVar127._0_4_ + fVar171 * fVar224;
    auVar235._4_4_ =
         (auVar127._4_4_ * (float)local_2a0._4_4_ + (float)local_220._4_4_ * fVar299) *
         auVar127._4_4_ + fVar299 * fVar245;
    auVar235._8_4_ =
         (auVar127._8_4_ * fStack_298 + fStack_218 * fVar244) * auVar127._8_4_ + fVar244 * fVar247;
    auVar235._12_4_ =
         (auVar127._12_4_ * fStack_294 + fStack_214 * fVar191) * auVar127._12_4_ + fVar191 * fVar249
    ;
    auVar235._16_4_ =
         (auVar127._16_4_ * fStack_290 + fStack_210 * fVar300) * auVar127._16_4_ + fVar300 * fVar250
    ;
    auVar235._20_4_ =
         (auVar127._20_4_ * fStack_28c + fStack_20c * fVar246) * auVar127._20_4_ + fVar246 * fVar251
    ;
    auVar235._24_4_ =
         (auVar127._24_4_ * fStack_288 + fStack_208 * fVar192) * auVar127._24_4_ + fVar192 * fVar252
    ;
    auVar235._28_4_ = fVar359 + fVar324 + fVar223;
    fVar254 = auVar296._0_4_ * fVar171 + auVar127._0_4_ * auVar90._0_4_;
    fVar267 = auVar296._4_4_ * fVar299 + auVar127._4_4_ * auVar90._4_4_;
    fVar270 = auVar296._8_4_ * fVar244 + auVar127._8_4_ * auVar90._8_4_;
    fVar273 = auVar296._12_4_ * fVar191 + auVar127._12_4_ * auVar90._12_4_;
    fVar276 = auVar296._16_4_ * fVar300 + auVar127._16_4_ * auVar90._16_4_;
    fVar279 = auVar296._20_4_ * fVar246 + auVar127._20_4_ * auVar90._20_4_;
    fVar282 = auVar296._24_4_ * fVar192 + auVar127._24_4_ * auVar90._24_4_;
    fVar284 = fVar359 + fStack_204;
    auVar361._0_4_ = auVar308._0_4_ * fVar171 + auVar127._0_4_ * auVar187._0_4_;
    auVar361._4_4_ = auVar308._4_4_ * fVar299 + auVar127._4_4_ * auVar187._4_4_;
    auVar361._8_4_ = auVar308._8_4_ * fVar244 + auVar127._8_4_ * auVar187._8_4_;
    auVar361._12_4_ = auVar308._12_4_ * fVar191 + auVar127._12_4_ * auVar187._12_4_;
    auVar361._16_4_ = auVar308._16_4_ * fVar300 + auVar127._16_4_ * auVar187._16_4_;
    auVar361._20_4_ = auVar308._20_4_ * fVar246 + auVar127._20_4_ * auVar187._20_4_;
    auVar361._24_4_ = auVar308._24_4_ * fVar192 + auVar127._24_4_ * auVar187._24_4_;
    auVar361._28_4_ = fStack_204 + fVar340;
    local_300._0_4_ = auVar318._0_4_ * fVar171 + auVar127._0_4_ * auVar208._0_4_;
    local_300._4_4_ = auVar318._4_4_ * fVar299 + auVar127._4_4_ * auVar208._4_4_;
    local_300._8_4_ = auVar318._8_4_ * fVar244 + auVar127._8_4_ * auVar208._8_4_;
    local_300._12_4_ = auVar318._12_4_ * fVar191 + auVar127._12_4_ * auVar208._12_4_;
    local_300._16_4_ = auVar318._16_4_ * fVar300 + auVar127._16_4_ * auVar208._16_4_;
    local_300._20_4_ = auVar318._20_4_ * fVar246 + auVar127._20_4_ * auVar208._20_4_;
    local_300._24_4_ = auVar318._24_4_ * fVar192 + auVar127._24_4_ * auVar208._24_4_;
    local_300._28_4_ = fVar340 + fStack_204;
    local_b40._0_4_ = auVar79._0_4_;
    auVar261._0_4_ = fVar171 * auVar290._0_4_ + auVar127._0_4_ * auVar235._0_4_;
    auVar261._4_4_ = fVar299 * auVar290._4_4_ + auVar127._4_4_ * auVar235._4_4_;
    auVar261._8_4_ = fVar244 * auVar290._8_4_ + auVar127._8_4_ * auVar235._8_4_;
    auVar261._12_4_ = fVar191 * auVar290._12_4_ + auVar127._12_4_ * auVar235._12_4_;
    auVar261._16_4_ = fVar300 * auVar290._16_4_ + auVar127._16_4_ * auVar235._16_4_;
    auVar261._20_4_ = fVar246 * auVar290._20_4_ + auVar127._20_4_ * auVar235._20_4_;
    auVar261._24_4_ = fVar192 * auVar290._24_4_ + auVar127._24_4_ * auVar235._24_4_;
    auVar261._28_4_ = auVar88._28_4_ + auVar127._28_4_;
    auVar88 = vsubps_avx(auVar90,auVar296);
    auVar13 = vsubps_avx(auVar187,auVar308);
    auVar362 = vsubps_avx(auVar208,auVar318);
    auVar89 = vsubps_avx(auVar235,auVar290);
    auVar226 = vshufps_avx(ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),
                           ZEXT416((uint)((float)local_b40._0_4_ * 0.04761905)),0);
    fVar216 = auVar226._0_4_;
    fVar329 = fVar216 * auVar88._0_4_ * 3.0;
    fVar217 = auVar226._4_4_;
    fVar334 = fVar217 * auVar88._4_4_ * 3.0;
    auVar17._4_4_ = fVar334;
    auVar17._0_4_ = fVar329;
    fVar168 = auVar226._8_4_;
    fVar335 = fVar168 * auVar88._8_4_ * 3.0;
    auVar17._8_4_ = fVar335;
    fVar195 = auVar226._12_4_;
    fVar336 = fVar195 * auVar88._12_4_ * 3.0;
    auVar17._12_4_ = fVar336;
    fVar337 = fVar216 * auVar88._16_4_ * 3.0;
    auVar17._16_4_ = fVar337;
    fVar338 = fVar217 * auVar88._20_4_ * 3.0;
    auVar17._20_4_ = fVar338;
    fVar339 = fVar168 * auVar88._24_4_ * 3.0;
    auVar17._24_4_ = fVar339;
    auVar17._28_4_ = fVar340;
    fVar317 = fVar216 * auVar13._0_4_ * 3.0;
    fVar322 = fVar217 * auVar13._4_4_ * 3.0;
    local_9c0._4_4_ = fVar322;
    local_9c0._0_4_ = fVar317;
    fVar323 = fVar168 * auVar13._8_4_ * 3.0;
    local_9c0._8_4_ = fVar323;
    fVar325 = fVar195 * auVar13._12_4_ * 3.0;
    local_9c0._12_4_ = fVar325;
    fVar326 = fVar216 * auVar13._16_4_ * 3.0;
    local_9c0._16_4_ = fVar326;
    fVar327 = fVar217 * auVar13._20_4_ * 3.0;
    local_9c0._20_4_ = fVar327;
    fVar328 = fVar168 * auVar13._24_4_ * 3.0;
    local_9c0._24_4_ = fVar328;
    local_9c0._28_4_ = auVar318._28_4_;
    fVar341 = fVar216 * auVar362._0_4_ * 3.0;
    fVar347 = fVar217 * auVar362._4_4_ * 3.0;
    auVar18._4_4_ = fVar347;
    auVar18._0_4_ = fVar341;
    fVar349 = fVar168 * auVar362._8_4_ * 3.0;
    auVar18._8_4_ = fVar349;
    fVar351 = fVar195 * auVar362._12_4_ * 3.0;
    auVar18._12_4_ = fVar351;
    fVar353 = fVar216 * auVar362._16_4_ * 3.0;
    auVar18._16_4_ = fVar353;
    fVar355 = fVar217 * auVar362._20_4_ * 3.0;
    auVar18._20_4_ = fVar355;
    fVar357 = fVar168 * auVar362._24_4_ * 3.0;
    auVar18._24_4_ = fVar357;
    auVar18._28_4_ = fVar359;
    fVar300 = fVar216 * auVar89._0_4_ * 3.0;
    fVar246 = fVar217 * auVar89._4_4_ * 3.0;
    auVar11._4_4_ = fVar246;
    auVar11._0_4_ = fVar300;
    fVar194 = fVar168 * auVar89._8_4_ * 3.0;
    auVar11._8_4_ = fVar194;
    fVar195 = fVar195 * auVar89._12_4_ * 3.0;
    auVar11._12_4_ = fVar195;
    fVar216 = fVar216 * auVar89._16_4_ * 3.0;
    auVar11._16_4_ = fVar216;
    fVar217 = fVar217 * auVar89._20_4_ * 3.0;
    auVar11._20_4_ = fVar217;
    fVar168 = fVar168 * auVar89._24_4_ * 3.0;
    auVar11._24_4_ = fVar168;
    auVar11._28_4_ = auVar13._28_4_;
    auVar88 = vperm2f128_avx(auVar361,auVar361,1);
    auVar88 = vshufps_avx(auVar88,auVar361,0x30);
    auVar90 = vshufps_avx(auVar361,auVar88,0x29);
    auVar88 = vperm2f128_avx(local_300,local_300,1);
    auVar88 = vshufps_avx(auVar88,local_300,0x30);
    auVar127 = vshufps_avx(local_300,auVar88,0x29);
    auVar362 = vsubps_avx(auVar261,auVar11);
    auVar88 = vperm2f128_avx(auVar362,auVar362,1);
    auVar88 = vshufps_avx(auVar88,auVar362,0x30);
    auVar11 = vshufps_avx(auVar362,auVar88,0x29);
    local_560 = vsubps_avx(auVar90,auVar361);
    local_320 = vsubps_avx(auVar127,local_300);
    fVar171 = local_560._0_4_;
    fVar192 = local_560._4_4_;
    auVar12._4_4_ = fVar347 * fVar192;
    auVar12._0_4_ = fVar341 * fVar171;
    fVar196 = local_560._8_4_;
    auVar12._8_4_ = fVar349 * fVar196;
    fVar218 = local_560._12_4_;
    auVar12._12_4_ = fVar351 * fVar218;
    fVar245 = local_560._16_4_;
    auVar12._16_4_ = fVar353 * fVar245;
    fVar253 = local_560._20_4_;
    auVar12._20_4_ = fVar355 * fVar253;
    fVar281 = local_560._24_4_;
    auVar12._24_4_ = fVar357 * fVar281;
    auVar12._28_4_ = auVar362._28_4_;
    fVar299 = local_320._0_4_;
    fVar301 = local_320._4_4_;
    auVar14._4_4_ = fVar322 * fVar301;
    auVar14._0_4_ = fVar317 * fVar299;
    fVar197 = local_320._8_4_;
    auVar14._8_4_ = fVar323 * fVar197;
    fVar219 = local_320._12_4_;
    auVar14._12_4_ = fVar325 * fVar219;
    fVar247 = local_320._16_4_;
    auVar14._16_4_ = fVar326 * fVar247;
    fVar266 = local_320._20_4_;
    auVar14._20_4_ = fVar327 * fVar266;
    fVar324 = local_320._24_4_;
    auVar14._24_4_ = fVar328 * fVar324;
    auVar14._28_4_ = auVar88._28_4_;
    auVar14 = vsubps_avx(auVar14,auVar12);
    auVar60._4_4_ = fVar267;
    auVar60._0_4_ = fVar254;
    auVar60._8_4_ = fVar270;
    auVar60._12_4_ = fVar273;
    auVar60._16_4_ = fVar276;
    auVar60._20_4_ = fVar279;
    auVar60._24_4_ = fVar282;
    auVar60._28_4_ = fVar284;
    auVar88 = vperm2f128_avx(auVar60,auVar60,1);
    auVar88 = vshufps_avx(auVar88,auVar60,0x30);
    auVar12 = vshufps_avx(auVar60,auVar88,0x29);
    local_580 = vsubps_avx(auVar12,auVar60);
    auVar15._4_4_ = fVar334 * fVar301;
    auVar15._0_4_ = fVar329 * fVar299;
    auVar15._8_4_ = fVar335 * fVar197;
    auVar15._12_4_ = fVar336 * fVar219;
    auVar15._16_4_ = fVar337 * fVar247;
    auVar15._20_4_ = fVar338 * fVar266;
    auVar15._24_4_ = fVar339 * fVar324;
    auVar15._28_4_ = auVar12._28_4_;
    fVar244 = local_580._0_4_;
    fVar248 = local_580._4_4_;
    auVar209._4_4_ = fVar347 * fVar248;
    auVar209._0_4_ = fVar341 * fVar244;
    fVar198 = local_580._8_4_;
    auVar209._8_4_ = fVar349 * fVar198;
    fVar220 = local_580._12_4_;
    auVar209._12_4_ = fVar351 * fVar220;
    fVar249 = local_580._16_4_;
    auVar209._16_4_ = fVar353 * fVar249;
    fVar269 = local_580._20_4_;
    auVar209._20_4_ = fVar355 * fVar269;
    fVar7 = local_580._24_4_;
    auVar209._24_4_ = fVar357 * fVar7;
    auVar209._28_4_ = auVar296._28_4_;
    auVar15 = vsubps_avx(auVar209,auVar15);
    auVar16._4_4_ = fVar322 * fVar248;
    auVar16._0_4_ = fVar317 * fVar244;
    auVar16._8_4_ = fVar323 * fVar198;
    auVar16._12_4_ = fVar325 * fVar220;
    auVar16._16_4_ = fVar326 * fVar249;
    auVar16._20_4_ = fVar327 * fVar269;
    auVar16._24_4_ = fVar328 * fVar7;
    auVar16._28_4_ = auVar296._28_4_;
    auVar19._4_4_ = fVar334 * fVar192;
    auVar19._0_4_ = fVar329 * fVar171;
    auVar19._8_4_ = fVar335 * fVar196;
    auVar19._12_4_ = fVar336 * fVar218;
    auVar19._16_4_ = fVar337 * fVar245;
    auVar19._20_4_ = fVar338 * fVar253;
    auVar19._24_4_ = fVar339 * fVar281;
    auVar19._28_4_ = auVar308._28_4_;
    auVar209 = vsubps_avx(auVar19,auVar16);
    fVar223 = auVar209._28_4_;
    auVar188._0_4_ = fVar244 * fVar244 + fVar171 * fVar171 + fVar299 * fVar299;
    auVar188._4_4_ = fVar248 * fVar248 + fVar192 * fVar192 + fVar301 * fVar301;
    auVar188._8_4_ = fVar198 * fVar198 + fVar196 * fVar196 + fVar197 * fVar197;
    auVar188._12_4_ = fVar220 * fVar220 + fVar218 * fVar218 + fVar219 * fVar219;
    auVar188._16_4_ = fVar249 * fVar249 + fVar245 * fVar245 + fVar247 * fVar247;
    auVar188._20_4_ = fVar269 * fVar269 + fVar253 * fVar253 + fVar266 * fVar266;
    auVar188._24_4_ = fVar7 * fVar7 + fVar281 * fVar281 + fVar324 * fVar324;
    auVar188._28_4_ = fVar223 + fVar223 + auVar14._28_4_;
    auVar88 = vrcpps_avx(auVar188);
    fVar224 = auVar88._0_4_;
    fVar251 = auVar88._4_4_;
    auVar20._4_4_ = fVar251 * auVar188._4_4_;
    auVar20._0_4_ = fVar224 * auVar188._0_4_;
    fVar252 = auVar88._8_4_;
    auVar20._8_4_ = fVar252 * auVar188._8_4_;
    fVar275 = auVar88._12_4_;
    auVar20._12_4_ = fVar275 * auVar188._12_4_;
    fVar278 = auVar88._16_4_;
    auVar20._16_4_ = fVar278 * auVar188._16_4_;
    fVar302 = auVar88._20_4_;
    auVar20._20_4_ = fVar302 * auVar188._20_4_;
    fVar303 = auVar88._24_4_;
    auVar20._24_4_ = fVar303 * auVar188._24_4_;
    auVar20._28_4_ = auVar308._28_4_;
    auVar91._8_4_ = 0x3f800000;
    auVar91._0_8_ = 0x3f8000003f800000;
    auVar91._12_4_ = 0x3f800000;
    auVar91._16_4_ = 0x3f800000;
    auVar91._20_4_ = 0x3f800000;
    auVar91._24_4_ = 0x3f800000;
    auVar91._28_4_ = 0x3f800000;
    auVar16 = vsubps_avx(auVar91,auVar20);
    fVar224 = fVar224 + fVar224 * auVar16._0_4_;
    fVar251 = fVar251 + fVar251 * auVar16._4_4_;
    fVar252 = fVar252 + fVar252 * auVar16._8_4_;
    fVar275 = fVar275 + fVar275 * auVar16._12_4_;
    fVar278 = fVar278 + fVar278 * auVar16._16_4_;
    fVar302 = fVar302 + fVar302 * auVar16._20_4_;
    fVar303 = fVar303 + fVar303 * auVar16._24_4_;
    auVar362 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar362 = vshufps_avx(auVar362,local_9c0,0x30);
    auVar362 = vshufps_avx(local_9c0,auVar362,0x29);
    auVar89 = vperm2f128_avx(auVar18,auVar18,1);
    auVar89 = vshufps_avx(auVar89,auVar18,0x30);
    local_a80 = vshufps_avx(auVar18,auVar89,0x29);
    fVar77 = local_a80._0_4_;
    fVar103 = local_a80._4_4_;
    auVar21._4_4_ = fVar103 * fVar192;
    auVar21._0_4_ = fVar77 * fVar171;
    fVar105 = local_a80._8_4_;
    auVar21._8_4_ = fVar105 * fVar196;
    fVar107 = local_a80._12_4_;
    auVar21._12_4_ = fVar107 * fVar218;
    fVar108 = local_a80._16_4_;
    auVar21._16_4_ = fVar108 * fVar245;
    fVar109 = local_a80._20_4_;
    auVar21._20_4_ = fVar109 * fVar253;
    fVar110 = local_a80._24_4_;
    auVar21._24_4_ = fVar110 * fVar281;
    auVar21._28_4_ = auVar89._28_4_;
    fVar191 = auVar362._0_4_;
    fVar193 = auVar362._4_4_;
    auVar22._4_4_ = fVar301 * fVar193;
    auVar22._0_4_ = fVar299 * fVar191;
    fVar199 = auVar362._8_4_;
    auVar22._8_4_ = fVar197 * fVar199;
    fVar221 = auVar362._12_4_;
    auVar22._12_4_ = fVar219 * fVar221;
    fVar250 = auVar362._16_4_;
    auVar22._16_4_ = fVar247 * fVar250;
    fVar272 = auVar362._20_4_;
    auVar22._20_4_ = fVar266 * fVar272;
    fVar8 = auVar362._24_4_;
    auVar22._24_4_ = fVar324 * fVar8;
    auVar22._28_4_ = auVar318._28_4_;
    auVar89 = vsubps_avx(auVar22,auVar21);
    auVar362 = vperm2f128_avx(auVar17,auVar17,1);
    auVar362 = vshufps_avx(auVar362,auVar17,0x30);
    local_a60 = vshufps_avx(auVar17,auVar362,0x29);
    fVar342 = local_a60._0_4_;
    fVar348 = local_a60._4_4_;
    auVar23._4_4_ = fVar348 * fVar301;
    auVar23._0_4_ = fVar342 * fVar299;
    fVar350 = local_a60._8_4_;
    auVar23._8_4_ = fVar350 * fVar197;
    fVar352 = local_a60._12_4_;
    auVar23._12_4_ = fVar352 * fVar219;
    fVar354 = local_a60._16_4_;
    auVar23._16_4_ = fVar354 * fVar247;
    fVar356 = local_a60._20_4_;
    auVar23._20_4_ = fVar356 * fVar266;
    fVar358 = local_a60._24_4_;
    auVar23._24_4_ = fVar358 * fVar324;
    auVar23._28_4_ = auVar362._28_4_;
    auVar24._4_4_ = fVar248 * fVar103;
    auVar24._0_4_ = fVar244 * fVar77;
    auVar24._8_4_ = fVar198 * fVar105;
    auVar24._12_4_ = fVar220 * fVar107;
    auVar24._16_4_ = fVar249 * fVar108;
    auVar24._20_4_ = fVar269 * fVar109;
    auVar24._24_4_ = fVar7 * fVar110;
    auVar24._28_4_ = fVar340;
    auVar362 = vsubps_avx(auVar24,auVar23);
    auVar25._4_4_ = fVar248 * fVar193;
    auVar25._0_4_ = fVar244 * fVar191;
    auVar25._8_4_ = fVar198 * fVar199;
    auVar25._12_4_ = fVar220 * fVar221;
    auVar25._16_4_ = fVar249 * fVar250;
    auVar25._20_4_ = fVar269 * fVar272;
    auVar25._24_4_ = fVar7 * fVar8;
    auVar25._28_4_ = fVar340;
    auVar26._4_4_ = fVar348 * fVar192;
    auVar26._0_4_ = fVar342 * fVar171;
    auVar26._8_4_ = fVar350 * fVar196;
    auVar26._12_4_ = fVar352 * fVar218;
    auVar26._16_4_ = fVar354 * fVar245;
    auVar26._20_4_ = fVar356 * fVar253;
    fVar340 = local_a60._28_4_;
    auVar26._24_4_ = fVar358 * fVar281;
    auVar26._28_4_ = fVar340;
    auVar17 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ =
         fVar251 * (auVar14._4_4_ * auVar14._4_4_ +
                   auVar209._4_4_ * auVar209._4_4_ + auVar15._4_4_ * auVar15._4_4_);
    auVar27._0_4_ =
         fVar224 * (auVar14._0_4_ * auVar14._0_4_ +
                   auVar209._0_4_ * auVar209._0_4_ + auVar15._0_4_ * auVar15._0_4_);
    auVar27._8_4_ =
         fVar252 * (auVar14._8_4_ * auVar14._8_4_ +
                   auVar209._8_4_ * auVar209._8_4_ + auVar15._8_4_ * auVar15._8_4_);
    auVar27._12_4_ =
         fVar275 * (auVar14._12_4_ * auVar14._12_4_ +
                   auVar209._12_4_ * auVar209._12_4_ + auVar15._12_4_ * auVar15._12_4_);
    auVar27._16_4_ =
         fVar278 * (auVar14._16_4_ * auVar14._16_4_ +
                   auVar209._16_4_ * auVar209._16_4_ + auVar15._16_4_ * auVar15._16_4_);
    auVar27._20_4_ =
         fVar302 * (auVar14._20_4_ * auVar14._20_4_ +
                   auVar209._20_4_ * auVar209._20_4_ + auVar15._20_4_ * auVar15._20_4_);
    auVar27._24_4_ =
         fVar303 * (auVar14._24_4_ * auVar14._24_4_ +
                   auVar209._24_4_ * auVar209._24_4_ + auVar15._24_4_ * auVar15._24_4_);
    auVar27._28_4_ = auVar14._28_4_ + fVar223 + auVar15._28_4_;
    auVar28._4_4_ =
         (auVar89._4_4_ * auVar89._4_4_ +
         auVar362._4_4_ * auVar362._4_4_ + auVar17._4_4_ * auVar17._4_4_) * fVar251;
    auVar28._0_4_ =
         (auVar89._0_4_ * auVar89._0_4_ +
         auVar362._0_4_ * auVar362._0_4_ + auVar17._0_4_ * auVar17._0_4_) * fVar224;
    auVar28._8_4_ =
         (auVar89._8_4_ * auVar89._8_4_ +
         auVar362._8_4_ * auVar362._8_4_ + auVar17._8_4_ * auVar17._8_4_) * fVar252;
    auVar28._12_4_ =
         (auVar89._12_4_ * auVar89._12_4_ +
         auVar362._12_4_ * auVar362._12_4_ + auVar17._12_4_ * auVar17._12_4_) * fVar275;
    auVar28._16_4_ =
         (auVar89._16_4_ * auVar89._16_4_ +
         auVar362._16_4_ * auVar362._16_4_ + auVar17._16_4_ * auVar17._16_4_) * fVar278;
    auVar28._20_4_ =
         (auVar89._20_4_ * auVar89._20_4_ +
         auVar362._20_4_ * auVar362._20_4_ + auVar17._20_4_ * auVar17._20_4_) * fVar302;
    auVar28._24_4_ =
         (auVar89._24_4_ * auVar89._24_4_ +
         auVar362._24_4_ * auVar362._24_4_ + auVar17._24_4_ * auVar17._24_4_) * fVar303;
    auVar28._28_4_ = auVar88._28_4_ + auVar16._28_4_;
    auVar88 = vmaxps_avx(auVar27,auVar28);
    auVar362 = vperm2f128_avx(auVar261,auVar261,1);
    auVar362 = vshufps_avx(auVar362,auVar261,0x30);
    auVar14 = vshufps_avx(auVar261,auVar362,0x29);
    auVar152._0_4_ = auVar261._0_4_ + fVar300;
    auVar152._4_4_ = auVar261._4_4_ + fVar246;
    auVar152._8_4_ = auVar261._8_4_ + fVar194;
    auVar152._12_4_ = auVar261._12_4_ + fVar195;
    auVar152._16_4_ = auVar261._16_4_ + fVar216;
    auVar152._20_4_ = auVar261._20_4_ + fVar217;
    auVar152._24_4_ = auVar261._24_4_ + fVar168;
    auVar152._28_4_ = auVar261._28_4_ + auVar13._28_4_;
    auVar362 = vmaxps_avx(auVar261,auVar152);
    auVar89 = vmaxps_avx(auVar11,auVar14);
    auVar362 = vmaxps_avx(auVar362,auVar89);
    auVar89 = vrsqrtps_avx(auVar188);
    fVar223 = auVar89._0_4_;
    fVar300 = auVar89._4_4_;
    fVar246 = auVar89._8_4_;
    fVar194 = auVar89._12_4_;
    fVar195 = auVar89._16_4_;
    fVar216 = auVar89._20_4_;
    fVar217 = auVar89._24_4_;
    local_620 = fVar223 * 1.5 + fVar223 * fVar223 * fVar223 * auVar188._0_4_ * -0.5;
    fStack_61c = fVar300 * 1.5 + fVar300 * fVar300 * fVar300 * auVar188._4_4_ * -0.5;
    fStack_618 = fVar246 * 1.5 + fVar246 * fVar246 * fVar246 * auVar188._8_4_ * -0.5;
    fStack_614 = fVar194 * 1.5 + fVar194 * fVar194 * fVar194 * auVar188._12_4_ * -0.5;
    fStack_610 = fVar195 * 1.5 + fVar195 * fVar195 * fVar195 * auVar188._16_4_ * -0.5;
    fStack_60c = fVar216 * 1.5 + fVar216 * fVar216 * fVar216 * auVar188._20_4_ * -0.5;
    fStack_608 = fVar217 * 1.5 + fVar217 * fVar217 * fVar217 * auVar188._24_4_ * -0.5;
    fStack_604 = auVar89._28_4_ + auVar188._28_4_;
    fVar222 = 0.0;
    auVar89 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_aa0 = vsubps_avx(auVar89,auVar361);
    auVar89 = vsubps_avx(auVar89,local_300);
    fVar307 = auVar89._0_4_;
    fVar311 = auVar89._4_4_;
    fVar312 = auVar89._8_4_;
    fVar313 = auVar89._12_4_;
    fVar314 = auVar89._16_4_;
    fVar315 = auVar89._20_4_;
    fVar316 = auVar89._24_4_;
    fVar300 = local_aa0._0_4_;
    fVar194 = local_aa0._4_4_;
    fVar216 = local_aa0._8_4_;
    fVar168 = local_aa0._12_4_;
    fVar251 = local_aa0._16_4_;
    fVar275 = local_aa0._20_4_;
    fVar302 = local_aa0._24_4_;
    auVar61._4_4_ = fVar267;
    auVar61._0_4_ = fVar254;
    auVar61._8_4_ = fVar270;
    auVar61._12_4_ = fVar273;
    auVar61._16_4_ = fVar276;
    auVar61._20_4_ = fVar279;
    auVar61._24_4_ = fVar282;
    auVar61._28_4_ = fVar284;
    auVar209 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar89 = vsubps_avx(auVar209,auVar61);
    fVar246 = auVar89._0_4_;
    fVar195 = auVar89._4_4_;
    fVar217 = auVar89._8_4_;
    fVar224 = auVar89._12_4_;
    fVar252 = auVar89._16_4_;
    fVar278 = auVar89._20_4_;
    fVar303 = auVar89._24_4_;
    auVar332._0_4_ =
         (float)local_820._0_4_ * fVar246 +
         (float)local_840._0_4_ * fVar300 + fVar307 * (float)local_900._0_4_;
    auVar332._4_4_ =
         (float)local_820._4_4_ * fVar195 +
         (float)local_840._4_4_ * fVar194 + fVar311 * (float)local_900._4_4_;
    auVar332._8_4_ = fStack_818 * fVar217 + fStack_838 * fVar216 + fVar312 * fStack_8f8;
    auVar332._12_4_ = fStack_814 * fVar224 + fStack_834 * fVar168 + fVar313 * fStack_8f4;
    auVar332._16_4_ = fStack_810 * fVar252 + fStack_830 * fVar251 + fVar314 * fStack_8f0;
    auVar332._20_4_ = fStack_80c * fVar278 + fStack_82c * fVar275 + fVar315 * fStack_8ec;
    auVar332._24_4_ = fStack_808 * fVar303 + fStack_828 * fVar302 + fVar316 * fStack_8e8;
    auVar332._28_4_ = fVar340 + auVar17._28_4_ + auVar188._28_4_;
    auVar345._0_4_ = fVar246 * fVar246 + fVar300 * fVar300 + fVar307 * fVar307;
    auVar345._4_4_ = fVar195 * fVar195 + fVar194 * fVar194 + fVar311 * fVar311;
    auVar345._8_4_ = fVar217 * fVar217 + fVar216 * fVar216 + fVar312 * fVar312;
    auVar345._12_4_ = fVar224 * fVar224 + fVar168 * fVar168 + fVar313 * fVar313;
    auVar345._16_4_ = fVar252 * fVar252 + fVar251 * fVar251 + fVar314 * fVar314;
    auVar345._20_4_ = fVar278 * fVar278 + fVar275 * fVar275 + fVar315 * fVar315;
    auVar345._24_4_ = fVar303 * fVar303 + fVar302 * fVar302 + fVar316 * fVar316;
    auVar345._28_4_ = local_300._28_4_ + local_300._28_4_ + fVar340;
    local_5a0 = (float)local_820._0_4_ * fVar244 * local_620 +
                local_620 * fVar171 * (float)local_840._0_4_ +
                fVar299 * local_620 * (float)local_900._0_4_;
    fStack_59c = (float)local_820._4_4_ * fVar248 * fStack_61c +
                 fStack_61c * fVar192 * (float)local_840._4_4_ +
                 fVar301 * fStack_61c * (float)local_900._4_4_;
    fStack_598 = fStack_818 * fVar198 * fStack_618 +
                 fStack_618 * fVar196 * fStack_838 + fVar197 * fStack_618 * fStack_8f8;
    fStack_594 = fStack_814 * fVar220 * fStack_614 +
                 fStack_614 * fVar218 * fStack_834 + fVar219 * fStack_614 * fStack_8f4;
    fStack_590 = fStack_810 * fVar249 * fStack_610 +
                 fStack_610 * fVar245 * fStack_830 + fVar247 * fStack_610 * fStack_8f0;
    fStack_58c = fStack_80c * fVar269 * fStack_60c +
                 fStack_60c * fVar253 * fStack_82c + fVar266 * fStack_60c * fStack_8ec;
    fStack_588 = fStack_808 * fVar7 * fStack_608 +
                 fStack_608 * fVar281 * fStack_828 + fVar324 * fStack_608 * fStack_8e8;
    fStack_584 = fStack_804 + fStack_824 + fStack_8e4;
    fVar223 = fStack_804 + fStack_824 + fStack_8e4;
    local_640 = fVar246 * fVar244 * local_620 +
                local_620 * fVar171 * fVar300 + fVar307 * fVar299 * local_620;
    fStack_63c = fVar195 * fVar248 * fStack_61c +
                 fStack_61c * fVar192 * fVar194 + fVar311 * fVar301 * fStack_61c;
    fStack_638 = fVar217 * fVar198 * fStack_618 +
                 fStack_618 * fVar196 * fVar216 + fVar312 * fVar197 * fStack_618;
    fStack_634 = fVar224 * fVar220 * fStack_614 +
                 fStack_614 * fVar218 * fVar168 + fVar313 * fVar219 * fStack_614;
    fStack_630 = fVar252 * fVar249 * fStack_610 +
                 fStack_610 * fVar245 * fVar251 + fVar314 * fVar247 * fStack_610;
    fStack_62c = fVar278 * fVar269 * fStack_60c +
                 fStack_60c * fVar253 * fVar275 + fVar315 * fVar266 * fStack_60c;
    fStack_628 = fVar303 * fVar7 * fStack_608 +
                 fStack_608 * fVar281 * fVar302 + fVar316 * fVar324 * fStack_608;
    fStack_624 = fStack_824 + fVar223;
    auVar13._4_4_ = fStack_59c * fStack_63c;
    auVar13._0_4_ = local_5a0 * local_640;
    auVar13._8_4_ = fStack_598 * fStack_638;
    auVar13._12_4_ = fStack_594 * fStack_634;
    auVar13._16_4_ = fStack_590 * fStack_630;
    auVar13._20_4_ = fStack_58c * fStack_62c;
    auVar13._24_4_ = fStack_588 * fStack_628;
    auVar13._28_4_ = fVar223;
    auVar89 = vsubps_avx(auVar332,auVar13);
    auVar29._4_4_ = fStack_63c * fStack_63c;
    auVar29._0_4_ = local_640 * local_640;
    auVar29._8_4_ = fStack_638 * fStack_638;
    auVar29._12_4_ = fStack_634 * fStack_634;
    auVar29._16_4_ = fStack_630 * fStack_630;
    auVar29._20_4_ = fStack_62c * fStack_62c;
    auVar29._24_4_ = fStack_628 * fStack_628;
    auVar29._28_4_ = fStack_824;
    auVar13 = vsubps_avx(auVar345,auVar29);
    local_2e0 = vsqrtps_avx(auVar88);
    fVar223 = (local_2e0._0_4_ + auVar362._0_4_) * 1.0000002;
    fVar340 = (local_2e0._4_4_ + auVar362._4_4_) * 1.0000002;
    fVar161 = (local_2e0._8_4_ + auVar362._8_4_) * 1.0000002;
    fVar162 = (local_2e0._12_4_ + auVar362._12_4_) * 1.0000002;
    fVar164 = (local_2e0._16_4_ + auVar362._16_4_) * 1.0000002;
    fVar166 = (local_2e0._20_4_ + auVar362._20_4_) * 1.0000002;
    fVar169 = (local_2e0._24_4_ + auVar362._24_4_) * 1.0000002;
    auVar30._4_4_ = fVar340 * fVar340;
    auVar30._0_4_ = fVar223 * fVar223;
    auVar30._8_4_ = fVar161 * fVar161;
    auVar30._12_4_ = fVar162 * fVar162;
    auVar30._16_4_ = fVar164 * fVar164;
    auVar30._20_4_ = fVar166 * fVar166;
    auVar30._24_4_ = fVar169 * fVar169;
    auVar30._28_4_ = local_2e0._28_4_ + auVar362._28_4_;
    local_a00._0_4_ = auVar89._0_4_ + auVar89._0_4_;
    local_a00._4_4_ = auVar89._4_4_ + auVar89._4_4_;
    local_a00._8_4_ = auVar89._8_4_ + auVar89._8_4_;
    local_a00._12_4_ = auVar89._12_4_ + auVar89._12_4_;
    local_a00._16_4_ = auVar89._16_4_ + auVar89._16_4_;
    local_a00._20_4_ = auVar89._20_4_ + auVar89._20_4_;
    local_a00._24_4_ = auVar89._24_4_ + auVar89._24_4_;
    fVar223 = auVar89._28_4_;
    local_a00._28_4_ = fVar223 + fVar223;
    auVar362 = vsubps_avx(auVar13,auVar30);
    auVar31._4_4_ = fStack_59c * fStack_59c;
    auVar31._0_4_ = local_5a0 * local_5a0;
    auVar31._8_4_ = fStack_598 * fStack_598;
    auVar31._12_4_ = fStack_594 * fStack_594;
    auVar31._16_4_ = fStack_590 * fStack_590;
    auVar31._20_4_ = fStack_58c * fStack_58c;
    auVar31._24_4_ = fStack_588 * fStack_588;
    auVar31._28_4_ = fVar223;
    auVar89 = vsubps_avx(local_2c0,auVar31);
    auVar32._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    auVar32._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar32._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    auVar32._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    auVar32._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    auVar32._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    auVar32._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    auVar32._28_4_ = local_2c0._28_4_;
    fVar223 = auVar89._0_4_;
    fVar340 = auVar89._4_4_;
    fVar161 = auVar89._8_4_;
    fVar162 = auVar89._12_4_;
    fVar164 = auVar89._16_4_;
    fStack_7f0 = fVar164 * 4.0;
    fVar166 = auVar89._20_4_;
    fStack_7ec = fVar166 * 4.0;
    fVar169 = auVar89._24_4_;
    fStack_7e8 = fVar169 * 4.0;
    uStack_7e4 = 0x40800000;
    auVar33._4_4_ = auVar362._4_4_ * fVar340 * 4.0;
    auVar33._0_4_ = auVar362._0_4_ * fVar223 * 4.0;
    auVar33._8_4_ = auVar362._8_4_ * fVar161 * 4.0;
    auVar33._12_4_ = auVar362._12_4_ * fVar162 * 4.0;
    auVar33._16_4_ = auVar362._16_4_ * fStack_7f0;
    auVar33._20_4_ = auVar362._20_4_ * fStack_7ec;
    auVar33._24_4_ = auVar362._24_4_ * fStack_7e8;
    auVar33._28_4_ = 0x40800000;
    auVar15 = vsubps_avx(auVar32,auVar33);
    auVar88 = vcmpps_avx(auVar15,auVar209,5);
    auVar215 = ZEXT3264(auVar88);
    auVar92._8_4_ = 0x7fffffff;
    auVar92._0_8_ = 0x7fffffff7fffffff;
    auVar92._12_4_ = 0x7fffffff;
    auVar92._16_4_ = 0x7fffffff;
    auVar92._20_4_ = 0x7fffffff;
    auVar92._24_4_ = 0x7fffffff;
    auVar92._28_4_ = 0x7fffffff;
    local_460 = vandps_avx(auVar31,auVar92);
    local_360._0_4_ = fVar223 + fVar223;
    local_360._4_4_ = fVar340 + fVar340;
    local_360._8_4_ = fVar161 + fVar161;
    local_360._12_4_ = fVar162 + fVar162;
    local_360._16_4_ = fVar164 + fVar164;
    local_360._20_4_ = fVar166 + fVar166;
    local_360._24_4_ = fVar169 + fVar169;
    local_360._28_4_ = auVar89._28_4_ + auVar89._28_4_;
    local_9e0 = vandps_avx(auVar89,auVar92);
    uVar67 = CONCAT44(local_a00._4_4_,local_a00._0_4_);
    local_340._0_8_ = uVar67 ^ 0x8000000080000000;
    local_340._8_4_ = -local_a00._8_4_;
    local_340._12_4_ = -local_a00._12_4_;
    local_340._16_4_ = -local_a00._16_4_;
    local_340._20_4_ = -local_a00._20_4_;
    local_340._24_4_ = -local_a00._24_4_;
    local_340._28_4_ = -local_a00._28_4_;
    if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar88 >> 0x7f,0) == '\0') &&
          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar88 >> 0xbf,0) == '\0') &&
        (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar88[0x1f]) {
      local_980._8_4_ = 0x7f800000;
      local_980._0_8_ = 0x7f8000007f800000;
      local_980._12_4_ = 0x7f800000;
      local_980._16_4_ = 0x7f800000;
      local_980._20_4_ = 0x7f800000;
      local_980._24_4_ = 0x7f800000;
      local_980._28_4_ = 0x7f800000;
      auVar153._8_4_ = 0xff800000;
      auVar153._0_8_ = 0xff800000ff800000;
      auVar153._12_4_ = 0xff800000;
      auVar153._16_4_ = 0xff800000;
      auVar153._20_4_ = 0xff800000;
      auVar153._24_4_ = 0xff800000;
      auVar153._28_4_ = 0xff800000;
    }
    else {
      auVar16 = vsqrtps_avx(auVar15);
      auVar89 = vrcpps_avx(local_360);
      auVar88 = vcmpps_avx(auVar15,auVar209,5);
      fVar222 = auVar88._28_4_;
      fVar164 = auVar89._0_4_;
      fVar166 = auVar89._4_4_;
      auVar34._4_4_ = local_360._4_4_ * fVar166;
      auVar34._0_4_ = local_360._0_4_ * fVar164;
      fVar169 = auVar89._8_4_;
      auVar34._8_4_ = local_360._8_4_ * fVar169;
      fVar163 = auVar89._12_4_;
      auVar34._12_4_ = local_360._12_4_ * fVar163;
      fVar165 = auVar89._16_4_;
      auVar34._16_4_ = local_360._16_4_ * fVar165;
      fVar167 = auVar89._20_4_;
      auVar34._20_4_ = local_360._20_4_ * fVar167;
      fVar170 = auVar89._24_4_;
      auVar34._24_4_ = local_360._24_4_ * fVar170;
      auVar34._28_4_ = auVar15._28_4_;
      auVar93._8_4_ = 0x3f800000;
      auVar93._0_8_ = 0x3f8000003f800000;
      auVar93._12_4_ = 0x3f800000;
      auVar93._16_4_ = 0x3f800000;
      auVar93._20_4_ = 0x3f800000;
      auVar93._24_4_ = 0x3f800000;
      auVar93._28_4_ = 0x3f800000;
      auVar15 = vsubps_avx(auVar93,auVar34);
      fVar164 = fVar164 + fVar164 * auVar15._0_4_;
      fVar166 = fVar166 + fVar166 * auVar15._4_4_;
      fVar169 = fVar169 + fVar169 * auVar15._8_4_;
      fVar163 = fVar163 + fVar163 * auVar15._12_4_;
      fVar165 = fVar165 + fVar165 * auVar15._16_4_;
      fVar167 = fVar167 + fVar167 * auVar15._20_4_;
      fVar170 = fVar170 + fVar170 * auVar15._24_4_;
      auVar209 = vsubps_avx(local_340,auVar16);
      fVar255 = auVar209._0_4_ * fVar164;
      fVar268 = auVar209._4_4_ * fVar166;
      auVar35._4_4_ = fVar268;
      auVar35._0_4_ = fVar255;
      fVar271 = auVar209._8_4_ * fVar169;
      auVar35._8_4_ = fVar271;
      fVar274 = auVar209._12_4_ * fVar163;
      auVar35._12_4_ = fVar274;
      fVar277 = auVar209._16_4_ * fVar165;
      auVar35._16_4_ = fVar277;
      fVar280 = auVar209._20_4_ * fVar167;
      auVar35._20_4_ = fVar280;
      fVar283 = auVar209._24_4_ * fVar170;
      auVar35._24_4_ = fVar283;
      auVar35._28_4_ = auVar209._28_4_;
      auVar209 = vsubps_avx(auVar16,local_a00);
      fVar164 = auVar209._0_4_ * fVar164;
      fVar166 = auVar209._4_4_ * fVar166;
      auVar36._4_4_ = fVar166;
      auVar36._0_4_ = fVar164;
      fVar169 = auVar209._8_4_ * fVar169;
      auVar36._8_4_ = fVar169;
      fVar163 = auVar209._12_4_ * fVar163;
      auVar36._12_4_ = fVar163;
      fVar165 = auVar209._16_4_ * fVar165;
      auVar36._16_4_ = fVar165;
      fVar167 = auVar209._20_4_ * fVar167;
      auVar36._20_4_ = fVar167;
      fVar170 = auVar209._24_4_ * fVar170;
      auVar36._24_4_ = fVar170;
      auVar36._28_4_ = auVar89._28_4_ + auVar15._28_4_;
      fStack_424 = fStack_624 + auVar209._28_4_;
      local_440 = local_620 * (local_640 + local_5a0 * fVar255);
      fStack_43c = fStack_61c * (fStack_63c + fStack_59c * fVar268);
      fStack_438 = fStack_618 * (fStack_638 + fStack_598 * fVar271);
      fStack_434 = fStack_614 * (fStack_634 + fStack_594 * fVar274);
      fStack_430 = fStack_610 * (fStack_630 + fStack_590 * fVar277);
      fStack_42c = fStack_60c * (fStack_62c + fStack_58c * fVar280);
      fStack_428 = fStack_608 * (fStack_628 + fStack_588 * fVar283);
      local_420 = local_620 * (local_640 + local_5a0 * fVar164);
      fStack_41c = fStack_61c * (fStack_63c + fStack_59c * fVar166);
      fStack_418 = fStack_618 * (fStack_638 + fStack_598 * fVar169);
      fStack_414 = fStack_614 * (fStack_634 + fStack_594 * fVar163);
      fStack_410 = fStack_610 * (fStack_630 + fStack_590 * fVar165);
      fStack_40c = fStack_60c * (fStack_62c + fStack_58c * fVar167);
      fStack_408 = fStack_608 * (fStack_628 + fStack_588 * fVar170);
      fStack_404 = fStack_624 + fStack_424;
      auVar236._8_4_ = 0x7f800000;
      auVar236._0_8_ = 0x7f8000007f800000;
      auVar236._12_4_ = 0x7f800000;
      auVar236._16_4_ = 0x7f800000;
      auVar236._20_4_ = 0x7f800000;
      auVar236._24_4_ = 0x7f800000;
      auVar236._28_4_ = 0x7f800000;
      local_980 = vblendvps_avx(auVar236,auVar35,auVar88);
      auVar237._8_4_ = 0xff800000;
      auVar237._0_8_ = 0xff800000ff800000;
      auVar237._12_4_ = 0xff800000;
      auVar237._16_4_ = 0xff800000;
      auVar237._20_4_ = 0xff800000;
      auVar237._24_4_ = 0xff800000;
      auVar237._28_4_ = 0xff800000;
      auVar153 = vblendvps_avx(auVar237,auVar36,auVar88);
      auVar89 = vmaxps_avx(local_5c0,local_460);
      auVar37._4_4_ = auVar89._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar89._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar89._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar89._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar89._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar89._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar89._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar89._28_4_;
      auVar89 = vcmpps_avx(local_9e0,auVar37,1);
      auVar15 = auVar88 & auVar89;
      if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar15 >> 0x7f,0) != '\0') ||
            (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar15 >> 0xbf,0) != '\0') ||
          (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar15[0x1f] < '\0') {
        auVar89 = vandps_avx(auVar89,auVar88);
        auVar226 = vpackssdw_avx(auVar89._0_16_,auVar89._16_16_);
        auVar15 = vcmpps_avx(auVar362,_DAT_01f7b000,2);
        auVar306._8_4_ = 0xff800000;
        auVar306._0_8_ = 0xff800000ff800000;
        auVar306._12_4_ = 0xff800000;
        auVar306._16_4_ = 0xff800000;
        auVar306._20_4_ = 0xff800000;
        auVar306._24_4_ = 0xff800000;
        auVar306._28_4_ = 0xff800000;
        auVar333._8_4_ = 0x7f800000;
        auVar333._0_8_ = 0x7f8000007f800000;
        auVar333._12_4_ = 0x7f800000;
        auVar333._16_4_ = 0x7f800000;
        auVar333._20_4_ = 0x7f800000;
        auVar333._24_4_ = 0x7f800000;
        auVar333._28_4_ = 0x7f800000;
        auVar362 = vblendvps_avx(auVar333,auVar306,auVar15);
        auVar145 = vpmovsxwd_avx(auVar226);
        auVar226 = vpunpckhwd_avx(auVar226,auVar226);
        auVar265._16_16_ = auVar226;
        auVar265._0_16_ = auVar145;
        local_980 = vblendvps_avx(local_980,auVar362,auVar265);
        auVar362 = vblendvps_avx(auVar306,auVar333,auVar15);
        auVar153 = vblendvps_avx(auVar153,auVar362,auVar265);
        auVar243._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
        auVar243._8_4_ = auVar89._8_4_ ^ 0xffffffff;
        auVar243._12_4_ = auVar89._12_4_ ^ 0xffffffff;
        auVar243._16_4_ = auVar89._16_4_ ^ 0xffffffff;
        auVar243._20_4_ = auVar89._20_4_ ^ 0xffffffff;
        auVar243._24_4_ = auVar89._24_4_ ^ 0xffffffff;
        auVar243._28_4_ = auVar89._28_4_ ^ 0xffffffff;
        auVar362 = vorps_avx(auVar15,auVar243);
        auVar88 = vandps_avx(auVar88,auVar362);
        auVar215 = ZEXT3264(auVar88);
      }
    }
    auVar262._8_4_ = 0x7fffffff;
    auVar262._0_8_ = 0x7fffffff7fffffff;
    auVar262._12_4_ = 0x7fffffff;
    auVar262._16_4_ = 0x7fffffff;
    auVar262._20_4_ = 0x7fffffff;
    auVar262._24_4_ = 0x7fffffff;
    auVar262._28_4_ = 0x7fffffff;
    auVar364 = ZEXT3264(local_9a0);
    auVar88 = local_540 & auVar215._0_32_;
    fVar164 = (float)local_920._0_4_;
    fVar166 = (float)local_920._4_4_;
    fVar169 = fStack_918;
    fVar163 = fStack_914;
    fVar165 = fStack_910;
    fVar167 = fStack_90c;
    fVar170 = fStack_908;
    fVar255 = fStack_904;
    if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar88 >> 0x7f,0) == '\0') &&
          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar88 >> 0xbf,0) == '\0') &&
        (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar88[0x1f]) {
      auVar310 = ZEXT3264(local_a40);
      auVar215 = ZEXT3264(local_8c0);
    }
    else {
      auVar364 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar226 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_950._0_4_));
      auVar226 = vshufps_avx(auVar226,auVar226,0);
      auVar238._16_16_ = auVar226;
      auVar238._0_16_ = auVar226;
      auVar15 = vminps_avx(auVar238,auVar153);
      auVar94._0_4_ =
           (float)local_820._0_4_ * fVar329 +
           (float)local_840._0_4_ * fVar317 + (float)local_900._0_4_ * fVar341;
      auVar94._4_4_ =
           (float)local_820._4_4_ * fVar334 +
           (float)local_840._4_4_ * fVar322 + (float)local_900._4_4_ * fVar347;
      auVar94._8_4_ = fStack_818 * fVar335 + fStack_838 * fVar323 + fStack_8f8 * fVar349;
      auVar94._12_4_ = fStack_814 * fVar336 + fStack_834 * fVar325 + fStack_8f4 * fVar351;
      auVar94._16_4_ = fStack_810 * fVar337 + fStack_830 * fVar326 + fStack_8f0 * fVar353;
      auVar94._20_4_ = fStack_80c * fVar338 + fStack_82c * fVar327 + fStack_8ec * fVar355;
      auVar94._24_4_ = fStack_808 * fVar339 + fStack_828 * fVar328 + fStack_8e8 * fVar357;
      auVar94._28_4_ = fVar359 + auVar318._28_4_ + fVar359;
      auVar89 = vrcpps_avx(auVar94);
      fVar359 = auVar89._0_4_;
      fVar268 = auVar89._4_4_;
      auVar38._4_4_ = auVar94._4_4_ * fVar268;
      auVar38._0_4_ = auVar94._0_4_ * fVar359;
      fVar271 = auVar89._8_4_;
      auVar38._8_4_ = auVar94._8_4_ * fVar271;
      fVar274 = auVar89._12_4_;
      auVar38._12_4_ = auVar94._12_4_ * fVar274;
      fVar277 = auVar89._16_4_;
      auVar38._16_4_ = auVar94._16_4_ * fVar277;
      fVar280 = auVar89._20_4_;
      auVar38._20_4_ = auVar94._20_4_ * fVar280;
      fVar283 = auVar89._24_4_;
      auVar38._24_4_ = auVar94._24_4_ * fVar283;
      auVar38._28_4_ = fVar222 + auVar226._12_4_;
      auVar291._8_4_ = 0x3f800000;
      auVar291._0_8_ = 0x3f8000003f800000;
      auVar291._12_4_ = 0x3f800000;
      auVar291._16_4_ = 0x3f800000;
      auVar291._20_4_ = 0x3f800000;
      auVar291._24_4_ = 0x3f800000;
      auVar291._28_4_ = 0x3f800000;
      auVar209 = vsubps_avx(auVar291,auVar38);
      auVar88 = vandps_avx(auVar94,auVar262);
      auVar346._8_4_ = 0x219392ef;
      auVar346._0_8_ = 0x219392ef219392ef;
      auVar346._12_4_ = 0x219392ef;
      auVar346._16_4_ = 0x219392ef;
      auVar346._20_4_ = 0x219392ef;
      auVar346._24_4_ = 0x219392ef;
      auVar346._28_4_ = 0x219392ef;
      auVar362 = vcmpps_avx(auVar88,auVar346,1);
      auVar39._4_4_ =
           (fVar268 + fVar268 * auVar209._4_4_) *
           -(fVar195 * fVar334 + fVar322 * fVar194 + fVar311 * fVar347);
      auVar39._0_4_ =
           (fVar359 + fVar359 * auVar209._0_4_) *
           -(fVar246 * fVar329 + fVar317 * fVar300 + fVar307 * fVar341);
      auVar39._8_4_ =
           (fVar271 + fVar271 * auVar209._8_4_) *
           -(fVar217 * fVar335 + fVar323 * fVar216 + fVar312 * fVar349);
      auVar39._12_4_ =
           (fVar274 + fVar274 * auVar209._12_4_) *
           -(fVar224 * fVar336 + fVar325 * fVar168 + fVar313 * fVar351);
      auVar39._16_4_ =
           (fVar277 + fVar277 * auVar209._16_4_) *
           -(fVar252 * fVar337 + fVar326 * fVar251 + fVar314 * fVar353);
      auVar39._20_4_ =
           (fVar280 + fVar280 * auVar209._20_4_) *
           -(fVar278 * fVar338 + fVar327 * fVar275 + fVar315 * fVar355);
      auVar39._24_4_ =
           (fVar283 + fVar283 * auVar209._24_4_) *
           -(fVar303 * fVar339 + fVar328 * fVar302 + fVar316 * fVar357);
      auVar39._28_4_ = auVar89._28_4_ + auVar209._28_4_;
      auVar89 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar88 = vcmpps_avx(auVar94,auVar89,1);
      auVar88 = vorps_avx(auVar362,auVar88);
      auVar305._8_4_ = 0xff800000;
      auVar305._0_8_ = 0xff800000ff800000;
      auVar305._12_4_ = 0xff800000;
      auVar305._16_4_ = 0xff800000;
      auVar305._20_4_ = 0xff800000;
      auVar305._24_4_ = 0xff800000;
      auVar305._28_4_ = 0xff800000;
      auVar88 = vblendvps_avx(auVar39,auVar305,auVar88);
      auVar89 = vcmpps_avx(auVar94,auVar89,6);
      auVar362 = vorps_avx(auVar362,auVar89);
      auVar309._8_4_ = 0x7f800000;
      auVar309._0_8_ = 0x7f8000007f800000;
      auVar309._12_4_ = 0x7f800000;
      auVar309._16_4_ = 0x7f800000;
      auVar309._20_4_ = 0x7f800000;
      auVar309._24_4_ = 0x7f800000;
      auVar309._28_4_ = 0x7f800000;
      auVar362 = vblendvps_avx(auVar39,auVar309,auVar362);
      auVar89 = vmaxps_avx(local_400,local_980);
      auVar89 = vmaxps_avx(auVar89,auVar88);
      auVar15 = vminps_avx(auVar15,auVar362);
      auVar209 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar88 = vsubps_avx(auVar209,auVar90);
      auVar362 = vsubps_avx(auVar209,auVar127);
      auVar40._4_4_ = auVar362._4_4_ * -fVar103;
      auVar40._0_4_ = auVar362._0_4_ * -fVar77;
      auVar40._8_4_ = auVar362._8_4_ * -fVar105;
      auVar40._12_4_ = auVar362._12_4_ * -fVar107;
      auVar40._16_4_ = auVar362._16_4_ * -fVar108;
      auVar40._20_4_ = auVar362._20_4_ * -fVar109;
      auVar40._24_4_ = auVar362._24_4_ * -fVar110;
      auVar40._28_4_ = auVar362._28_4_;
      auVar41._4_4_ = fVar193 * auVar88._4_4_;
      auVar41._0_4_ = fVar191 * auVar88._0_4_;
      auVar41._8_4_ = fVar199 * auVar88._8_4_;
      auVar41._12_4_ = fVar221 * auVar88._12_4_;
      auVar41._16_4_ = fVar250 * auVar88._16_4_;
      auVar41._20_4_ = fVar272 * auVar88._20_4_;
      auVar41._24_4_ = fVar8 * auVar88._24_4_;
      auVar41._28_4_ = auVar88._28_4_;
      auVar88 = vsubps_avx(auVar40,auVar41);
      auVar362 = vsubps_avx(auVar209,auVar12);
      auVar42._4_4_ = fVar348 * auVar362._4_4_;
      auVar42._0_4_ = fVar342 * auVar362._0_4_;
      auVar42._8_4_ = fVar350 * auVar362._8_4_;
      auVar42._12_4_ = fVar352 * auVar362._12_4_;
      auVar42._16_4_ = fVar354 * auVar362._16_4_;
      auVar42._20_4_ = fVar356 * auVar362._20_4_;
      uVar73 = auVar362._28_4_;
      auVar42._24_4_ = fVar358 * auVar362._24_4_;
      auVar42._28_4_ = uVar73;
      auVar90 = vsubps_avx(auVar88,auVar42);
      auVar43._4_4_ = (float)local_900._4_4_ * -fVar103;
      auVar43._0_4_ = (float)local_900._0_4_ * -fVar77;
      auVar43._8_4_ = fStack_8f8 * -fVar105;
      auVar43._12_4_ = fStack_8f4 * -fVar107;
      auVar43._16_4_ = fStack_8f0 * -fVar108;
      auVar43._20_4_ = fStack_8ec * -fVar109;
      auVar43._24_4_ = fStack_8e8 * -fVar110;
      auVar43._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar44._4_4_ = (float)local_840._4_4_ * fVar193;
      auVar44._0_4_ = (float)local_840._0_4_ * fVar191;
      auVar44._8_4_ = fStack_838 * fVar199;
      auVar44._12_4_ = fStack_834 * fVar221;
      auVar44._16_4_ = fStack_830 * fVar250;
      auVar44._20_4_ = fStack_82c * fVar272;
      auVar44._24_4_ = fStack_828 * fVar8;
      auVar44._28_4_ = uVar73;
      auVar319._8_4_ = 0x3f800000;
      auVar319._0_8_ = 0x3f8000003f800000;
      auVar319._12_4_ = 0x3f800000;
      auVar319._16_4_ = 0x3f800000;
      auVar319._20_4_ = 0x3f800000;
      auVar319._24_4_ = 0x3f800000;
      auVar319._28_4_ = 0x3f800000;
      auVar88 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar348 * (float)local_820._4_4_;
      auVar45._0_4_ = fVar342 * (float)local_820._0_4_;
      auVar45._8_4_ = fVar350 * fStack_818;
      auVar45._12_4_ = fVar352 * fStack_814;
      auVar45._16_4_ = fVar354 * fStack_810;
      auVar45._20_4_ = fVar356 * fStack_80c;
      auVar45._24_4_ = fVar358 * fStack_808;
      auVar45._28_4_ = uVar73;
      auVar127 = vsubps_avx(auVar88,auVar45);
      auVar88 = vrcpps_avx(auVar127);
      fVar191 = auVar88._0_4_;
      fVar300 = auVar88._4_4_;
      auVar46._4_4_ = auVar127._4_4_ * fVar300;
      auVar46._0_4_ = auVar127._0_4_ * fVar191;
      fVar246 = auVar88._8_4_;
      auVar46._8_4_ = auVar127._8_4_ * fVar246;
      fVar193 = auVar88._12_4_;
      auVar46._12_4_ = auVar127._12_4_ * fVar193;
      fVar194 = auVar88._16_4_;
      auVar46._16_4_ = auVar127._16_4_ * fVar194;
      fVar195 = auVar88._20_4_;
      auVar46._20_4_ = auVar127._20_4_ * fVar195;
      fVar199 = auVar88._24_4_;
      auVar46._24_4_ = auVar127._24_4_ * fVar199;
      auVar46._28_4_ = fStack_8e4;
      auVar209 = vsubps_avx(auVar319,auVar46);
      auVar88 = vandps_avx(auVar127,auVar262);
      auVar263._8_4_ = 0x219392ef;
      auVar263._0_8_ = 0x219392ef219392ef;
      auVar263._12_4_ = 0x219392ef;
      auVar263._16_4_ = 0x219392ef;
      auVar263._20_4_ = 0x219392ef;
      auVar263._24_4_ = 0x219392ef;
      auVar263._28_4_ = 0x219392ef;
      auVar362 = vcmpps_avx(auVar88,auVar263,1);
      auVar47._4_4_ = (fVar300 + fVar300 * auVar209._4_4_) * -auVar90._4_4_;
      auVar47._0_4_ = (fVar191 + fVar191 * auVar209._0_4_) * -auVar90._0_4_;
      auVar47._8_4_ = (fVar246 + fVar246 * auVar209._8_4_) * -auVar90._8_4_;
      auVar47._12_4_ = (fVar193 + fVar193 * auVar209._12_4_) * -auVar90._12_4_;
      auVar47._16_4_ = (fVar194 + fVar194 * auVar209._16_4_) * -auVar90._16_4_;
      auVar47._20_4_ = (fVar195 + fVar195 * auVar209._20_4_) * -auVar90._20_4_;
      auVar47._24_4_ = (fVar199 + fVar199 * auVar209._24_4_) * -auVar90._24_4_;
      auVar47._28_4_ = auVar90._28_4_ ^ 0x80000000;
      auVar88 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,1);
      auVar88 = vorps_avx(auVar362,auVar88);
      auVar88 = vblendvps_avx(auVar47,auVar305,auVar88);
      local_860 = vmaxps_avx(auVar89,auVar88);
      auVar88 = vcmpps_avx(auVar127,ZEXT832(0) << 0x20,6);
      auVar88 = vorps_avx(auVar362,auVar88);
      auVar362 = vblendvps_avx(auVar47,auVar309,auVar88);
      auVar88 = vandps_avx(auVar215._0_32_,local_540);
      local_480 = vminps_avx(auVar15,auVar362);
      auVar362 = vcmpps_avx(local_860,local_480,2);
      auVar89 = auVar88 & auVar362;
      if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar89 >> 0x7f,0) != '\0') ||
            (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar89 >> 0xbf,0) != '\0') ||
          (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar89[0x1f] < '\0') {
        auVar89 = vminps_avx(auVar261,auVar152);
        auVar90 = vminps_avx(auVar11,auVar14);
        auVar89 = vminps_avx(auVar89,auVar90);
        auVar89 = vsubps_avx(auVar89,local_2e0);
        auVar88 = vandps_avx(auVar362,auVar88);
        auVar62._4_4_ = fStack_43c;
        auVar62._0_4_ = local_440;
        auVar62._8_4_ = fStack_438;
        auVar62._12_4_ = fStack_434;
        auVar62._16_4_ = fStack_430;
        auVar62._20_4_ = fStack_42c;
        auVar62._24_4_ = fStack_428;
        auVar62._28_4_ = fStack_424;
        auVar362 = vminps_avx(auVar62,auVar319);
        auVar207 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar362 = vmaxps_avx(auVar362,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar76 + fVar111 * (auVar362._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar102 + fVar139 * (auVar362._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar104 + fVar140 * (auVar362._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar106 + fVar141 * (auVar362._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar76 + fVar111 * (auVar362._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar102 + fVar139 * (auVar362._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar104 + fVar140 * (auVar362._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar106 + auVar362._28_4_ + 7.0;
        auVar63._4_4_ = fStack_41c;
        auVar63._0_4_ = local_420;
        auVar63._8_4_ = fStack_418;
        auVar63._12_4_ = fStack_414;
        auVar63._16_4_ = fStack_410;
        auVar63._20_4_ = fStack_40c;
        auVar63._24_4_ = fStack_408;
        auVar63._28_4_ = fStack_404;
        auVar362 = vminps_avx(auVar63,auVar319);
        auVar362 = vmaxps_avx(auVar362,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar76 + fVar111 * (auVar362._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar102 + fVar139 * (auVar362._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar104 + fVar140 * (auVar362._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar106 + fVar141 * (auVar362._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar76 + fVar111 * (auVar362._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar102 + fVar139 * (auVar362._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar104 + fVar140 * (auVar362._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar106 + auVar362._28_4_ + 7.0;
        auVar48._4_4_ = auVar89._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar89._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar89._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar89._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar89._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar89._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar89._24_4_ * 0.99999976;
        auVar48._28_4_ = 0x3f7ffffc;
        auVar362 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
        auVar49._4_4_ = auVar362._4_4_ * auVar362._4_4_;
        auVar49._0_4_ = auVar362._0_4_ * auVar362._0_4_;
        auVar49._8_4_ = auVar362._8_4_ * auVar362._8_4_;
        auVar49._12_4_ = auVar362._12_4_ * auVar362._12_4_;
        auVar49._16_4_ = auVar362._16_4_ * auVar362._16_4_;
        auVar49._20_4_ = auVar362._20_4_ * auVar362._20_4_;
        auVar49._24_4_ = auVar362._24_4_ * auVar362._24_4_;
        auVar49._28_4_ = auVar362._28_4_;
        local_b20 = vsubps_avx(auVar13,auVar49);
        auVar50._4_4_ = local_b20._4_4_ * fVar340 * 4.0;
        auVar50._0_4_ = local_b20._0_4_ * fVar223 * 4.0;
        auVar50._8_4_ = local_b20._8_4_ * fVar161 * 4.0;
        auVar50._12_4_ = local_b20._12_4_ * fVar162 * 4.0;
        auVar50._16_4_ = local_b20._16_4_ * fStack_7f0;
        auVar50._20_4_ = local_b20._20_4_ * fStack_7ec;
        auVar50._24_4_ = local_b20._24_4_ * fStack_7e8;
        auVar50._28_4_ = auVar362._28_4_;
        auVar89 = vsubps_avx(auVar32,auVar50);
        auVar362 = vcmpps_avx(auVar89,ZEXT832(0) << 0x20,5);
        if ((((((((auVar362 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar362 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar362 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar362 >> 0x7f,0) == '\0') &&
              (auVar362 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar362 >> 0xbf,0) == '\0') &&
            (auVar362 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar362[0x1f]) {
          auVar260 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar233 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar365 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_b60 = ZEXT832(0) << 0x20;
          auVar292._8_4_ = 0x7f800000;
          auVar292._0_8_ = 0x7f8000007f800000;
          auVar292._12_4_ = 0x7f800000;
          auVar292._16_4_ = 0x7f800000;
          auVar292._20_4_ = 0x7f800000;
          auVar292._24_4_ = 0x7f800000;
          auVar292._28_4_ = 0x7f800000;
          auVar320._8_4_ = 0xff800000;
          auVar320._0_8_ = 0xff800000ff800000;
          auVar320._12_4_ = 0xff800000;
          auVar320._16_4_ = 0xff800000;
          auVar320._20_4_ = 0xff800000;
          auVar320._24_4_ = 0xff800000;
          auVar320._28_4_ = 0xff800000;
          _local_b40 = _local_b60;
          local_b20 = auVar12;
        }
        else {
          auVar90 = vrcpps_avx(local_360);
          fVar223 = auVar90._0_4_;
          auVar210._0_4_ = local_360._0_4_ * fVar223;
          fVar191 = auVar90._4_4_;
          auVar210._4_4_ = local_360._4_4_ * fVar191;
          fVar300 = auVar90._8_4_;
          auVar210._8_4_ = local_360._8_4_ * fVar300;
          fVar246 = auVar90._12_4_;
          auVar210._12_4_ = local_360._12_4_ * fVar246;
          fVar193 = auVar90._16_4_;
          auVar210._16_4_ = local_360._16_4_ * fVar193;
          fVar194 = auVar90._20_4_;
          auVar210._20_4_ = local_360._20_4_ * fVar194;
          fVar195 = auVar90._24_4_;
          auVar210._24_4_ = local_360._24_4_ * fVar195;
          auVar210._28_4_ = 0;
          auVar11 = vsubps_avx(auVar319,auVar210);
          auVar127 = vsqrtps_avx(auVar89);
          fVar223 = fVar223 + fVar223 * auVar11._0_4_;
          fVar191 = fVar191 + fVar191 * auVar11._4_4_;
          fVar300 = fVar300 + fVar300 * auVar11._8_4_;
          fVar246 = fVar246 + fVar246 * auVar11._12_4_;
          fVar193 = fVar193 + fVar193 * auVar11._16_4_;
          fVar194 = fVar194 + fVar194 * auVar11._20_4_;
          fVar195 = fVar195 + fVar195 * auVar11._24_4_;
          auVar12 = vsubps_avx(local_340,auVar127);
          auVar310._0_4_ = auVar12._0_4_ * fVar223;
          auVar310._4_4_ = auVar12._4_4_ * fVar191;
          auVar310._8_4_ = auVar12._8_4_ * fVar300;
          auVar310._12_4_ = auVar12._12_4_ * fVar246;
          auVar310._16_4_ = auVar12._16_4_ * fVar193;
          auVar310._20_4_ = auVar12._20_4_ * fVar194;
          auVar310._28_36_ = auVar215._28_36_;
          auVar310._24_4_ = auVar12._24_4_ * fVar195;
          auVar12 = vsubps_avx(auVar127,local_a00);
          fVar223 = auVar12._0_4_ * fVar223;
          fVar191 = auVar12._4_4_ * fVar191;
          auVar51._4_4_ = fVar191;
          auVar51._0_4_ = fVar223;
          fVar300 = auVar12._8_4_ * fVar300;
          auVar51._8_4_ = fVar300;
          fVar246 = auVar12._12_4_ * fVar246;
          auVar51._12_4_ = fVar246;
          fVar193 = auVar12._16_4_ * fVar193;
          auVar51._16_4_ = fVar193;
          fVar194 = auVar12._20_4_ * fVar194;
          auVar51._20_4_ = fVar194;
          fVar195 = auVar12._24_4_ * fVar195;
          auVar51._24_4_ = fVar195;
          auVar51._28_4_ = fVar141;
          fVar199 = (auVar310._0_4_ * local_5a0 + local_640) * local_620;
          fVar216 = (auVar310._4_4_ * fStack_59c + fStack_63c) * fStack_61c;
          fVar217 = (auVar310._8_4_ * fStack_598 + fStack_638) * fStack_618;
          fVar221 = (auVar310._12_4_ * fStack_594 + fStack_634) * fStack_614;
          fVar168 = (auVar310._16_4_ * fStack_590 + fStack_630) * fStack_610;
          fVar224 = (auVar310._20_4_ * fStack_58c + fStack_62c) * fStack_60c;
          fVar250 = (auVar310._24_4_ * fStack_588 + fStack_628) * fStack_608;
          auVar154._0_4_ = fVar254 + fVar199 * fVar244;
          auVar154._4_4_ = fVar267 + fVar216 * fVar248;
          auVar154._8_4_ = fVar270 + fVar217 * fVar198;
          auVar154._12_4_ = fVar273 + fVar221 * fVar220;
          auVar154._16_4_ = fVar276 + fVar168 * fVar249;
          auVar154._20_4_ = fVar279 + fVar224 * fVar269;
          auVar154._24_4_ = fVar282 + fVar250 * fVar7;
          auVar154._28_4_ = fVar284 + auVar90._28_4_ + auVar11._28_4_ + fStack_624;
          auVar52._4_4_ = auVar310._4_4_ * (float)local_820._4_4_;
          auVar52._0_4_ = auVar310._0_4_ * (float)local_820._0_4_;
          auVar52._8_4_ = auVar310._8_4_ * fStack_818;
          auVar52._12_4_ = auVar310._12_4_ * fStack_814;
          auVar52._16_4_ = auVar310._16_4_ * fStack_810;
          auVar52._20_4_ = auVar310._20_4_ * fStack_80c;
          auVar52._24_4_ = auVar310._24_4_ * fStack_808;
          auVar52._28_4_ = auVar127._28_4_;
          local_9c0 = vsubps_avx(auVar52,auVar154);
          auVar239._0_4_ = auVar361._0_4_ + fVar199 * fVar171;
          auVar239._4_4_ = auVar361._4_4_ + fVar216 * fVar192;
          auVar239._8_4_ = auVar361._8_4_ + fVar217 * fVar196;
          auVar239._12_4_ = auVar361._12_4_ + fVar221 * fVar218;
          auVar239._16_4_ = auVar361._16_4_ + fVar168 * fVar245;
          auVar239._20_4_ = auVar361._20_4_ + fVar224 * fVar253;
          auVar239._24_4_ = auVar361._24_4_ + fVar250 * fVar281;
          auVar239._28_4_ = auVar361._28_4_ + auVar127._28_4_;
          auVar53._4_4_ = (float)local_840._4_4_ * auVar310._4_4_;
          auVar53._0_4_ = (float)local_840._0_4_ * auVar310._0_4_;
          auVar53._8_4_ = fStack_838 * auVar310._8_4_;
          auVar53._12_4_ = fStack_834 * auVar310._12_4_;
          auVar53._16_4_ = fStack_830 * auVar310._16_4_;
          auVar53._20_4_ = fStack_82c * auVar310._20_4_;
          auVar53._24_4_ = fStack_828 * auVar310._24_4_;
          auVar53._28_4_ = 0x3e000000;
          _local_b40 = vsubps_avx(auVar53,auVar239);
          auVar211._0_4_ = local_300._0_4_ + fVar299 * fVar199;
          auVar211._4_4_ = local_300._4_4_ + fVar301 * fVar216;
          auVar211._8_4_ = local_300._8_4_ + fVar197 * fVar217;
          auVar211._12_4_ = local_300._12_4_ + fVar219 * fVar221;
          auVar211._16_4_ = local_300._16_4_ + fVar247 * fVar168;
          auVar211._20_4_ = local_300._20_4_ + fVar266 * fVar224;
          auVar211._24_4_ = local_300._24_4_ + fVar324 * fVar250;
          auVar211._28_4_ = local_300._28_4_ + auVar12._28_4_;
          auVar54._4_4_ = auVar310._4_4_ * (float)local_900._4_4_;
          auVar54._0_4_ = auVar310._0_4_ * (float)local_900._0_4_;
          auVar54._8_4_ = auVar310._8_4_ * fStack_8f8;
          auVar54._12_4_ = auVar310._12_4_ * fStack_8f4;
          auVar54._16_4_ = auVar310._16_4_ * fStack_8f0;
          auVar54._20_4_ = auVar310._20_4_ * fStack_8ec;
          auVar54._24_4_ = auVar310._24_4_ * fStack_8e8;
          auVar54._28_4_ = auVar239._28_4_;
          _local_b60 = vsubps_avx(auVar54,auVar211);
          fVar199 = (fVar223 * local_5a0 + local_640) * local_620;
          fVar216 = (fVar191 * fStack_59c + fStack_63c) * fStack_61c;
          fVar217 = (fVar300 * fStack_598 + fStack_638) * fStack_618;
          fVar221 = (fVar246 * fStack_594 + fStack_634) * fStack_614;
          fVar168 = (fVar193 * fStack_590 + fStack_630) * fStack_610;
          fVar224 = (fVar194 * fStack_58c + fStack_62c) * fStack_60c;
          fVar250 = (fVar195 * fStack_588 + fStack_628) * fStack_608;
          auVar212._0_4_ = fVar254 + fVar199 * fVar244;
          auVar212._4_4_ = fVar267 + fVar216 * fVar248;
          auVar212._8_4_ = fVar270 + fVar217 * fVar198;
          auVar212._12_4_ = fVar273 + fVar221 * fVar220;
          auVar212._16_4_ = fVar276 + fVar168 * fVar249;
          auVar212._20_4_ = fVar279 + fVar224 * fVar269;
          auVar212._24_4_ = fVar282 + fVar250 * fVar7;
          auVar212._28_4_ = fVar284 + local_b60._28_4_ + fStack_624;
          auVar55._4_4_ = fVar191 * (float)local_820._4_4_;
          auVar55._0_4_ = fVar223 * (float)local_820._0_4_;
          auVar55._8_4_ = fVar300 * fStack_818;
          auVar55._12_4_ = fVar246 * fStack_814;
          auVar55._16_4_ = fVar193 * fStack_810;
          auVar55._20_4_ = fVar194 * fStack_80c;
          auVar55._24_4_ = fVar195 * fStack_808;
          auVar55._28_4_ = 0x3e000000;
          auVar90 = vsubps_avx(auVar55,auVar212);
          auVar207 = auVar90._0_28_;
          auVar264._0_4_ = auVar361._0_4_ + fVar199 * fVar171;
          auVar264._4_4_ = auVar361._4_4_ + fVar216 * fVar192;
          auVar264._8_4_ = auVar361._8_4_ + fVar217 * fVar196;
          auVar264._12_4_ = auVar361._12_4_ + fVar221 * fVar218;
          auVar264._16_4_ = auVar361._16_4_ + fVar168 * fVar245;
          auVar264._20_4_ = auVar361._20_4_ + fVar224 * fVar253;
          auVar264._24_4_ = auVar361._24_4_ + fVar250 * fVar281;
          auVar264._28_4_ = auVar361._28_4_ + 0.125;
          auVar56._4_4_ = (float)local_840._4_4_ * fVar191;
          auVar56._0_4_ = (float)local_840._0_4_ * fVar223;
          auVar56._8_4_ = fStack_838 * fVar300;
          auVar56._12_4_ = fStack_834 * fVar246;
          auVar56._16_4_ = fStack_830 * fVar193;
          auVar56._20_4_ = fStack_82c * fVar194;
          auVar56._24_4_ = fStack_828 * fVar195;
          auVar56._28_4_ = fStack_804;
          auVar90 = vsubps_avx(auVar56,auVar264);
          auVar260 = auVar90._0_28_;
          auVar240._0_4_ = local_300._0_4_ + fVar299 * fVar199;
          auVar240._4_4_ = local_300._4_4_ + fVar301 * fVar216;
          auVar240._8_4_ = local_300._8_4_ + fVar197 * fVar217;
          auVar240._12_4_ = local_300._12_4_ + fVar219 * fVar221;
          auVar240._16_4_ = local_300._16_4_ + fVar247 * fVar168;
          auVar240._20_4_ = local_300._20_4_ + fVar266 * fVar224;
          auVar240._24_4_ = local_300._24_4_ + fVar324 * fVar250;
          auVar240._28_4_ = local_300._28_4_ + auVar239._28_4_;
          auVar57._4_4_ = fVar191 * (float)local_900._4_4_;
          auVar57._0_4_ = fVar223 * (float)local_900._0_4_;
          auVar57._8_4_ = fVar300 * fStack_8f8;
          auVar57._12_4_ = fVar246 * fStack_8f4;
          auVar57._16_4_ = fVar193 * fStack_8f0;
          auVar57._20_4_ = fVar194 * fStack_8ec;
          auVar57._24_4_ = fVar195 * fStack_8e8;
          auVar57._28_4_ = fStack_804;
          auVar90 = vsubps_avx(auVar57,auVar240);
          auVar233 = auVar90._0_28_;
          auVar89 = vcmpps_avx(auVar89,ZEXT832(0) << 0x20,5);
          auVar293._8_4_ = 0x7f800000;
          auVar293._0_8_ = 0x7f8000007f800000;
          auVar293._12_4_ = 0x7f800000;
          auVar293._16_4_ = 0x7f800000;
          auVar293._20_4_ = 0x7f800000;
          auVar293._24_4_ = 0x7f800000;
          auVar293._28_4_ = 0x7f800000;
          auVar292 = vblendvps_avx(auVar293,auVar310._0_32_,auVar89);
          auVar90 = vmaxps_avx(local_5c0,local_460);
          auVar58._4_4_ = auVar90._4_4_ * 1.9073486e-06;
          auVar58._0_4_ = auVar90._0_4_ * 1.9073486e-06;
          auVar58._8_4_ = auVar90._8_4_ * 1.9073486e-06;
          auVar58._12_4_ = auVar90._12_4_ * 1.9073486e-06;
          auVar58._16_4_ = auVar90._16_4_ * 1.9073486e-06;
          auVar58._20_4_ = auVar90._20_4_ * 1.9073486e-06;
          auVar58._24_4_ = auVar90._24_4_ * 1.9073486e-06;
          auVar58._28_4_ = auVar90._28_4_;
          auVar90 = vcmpps_avx(local_9e0,auVar58,1);
          auVar321._8_4_ = 0xff800000;
          auVar321._0_8_ = 0xff800000ff800000;
          auVar321._12_4_ = 0xff800000;
          auVar321._16_4_ = 0xff800000;
          auVar321._20_4_ = 0xff800000;
          auVar321._24_4_ = 0xff800000;
          auVar321._28_4_ = 0xff800000;
          auVar320 = vblendvps_avx(auVar321,auVar51,auVar89);
          auVar127 = auVar89 & auVar90;
          if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar127 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar127 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar127 >> 0x7f,0) != '\0') ||
                (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar127 >> 0xbf,0) != '\0') ||
              (auVar127 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar127[0x1f] < '\0') {
            auVar362 = vandps_avx(auVar90,auVar89);
            auVar226 = vpackssdw_avx(auVar362._0_16_,auVar362._16_16_);
            auVar127 = vcmpps_avx(local_b20,_DAT_01f7b000,2);
            auVar138._8_4_ = 0xff800000;
            auVar138._0_8_ = 0xff800000ff800000;
            auVar138._12_4_ = 0xff800000;
            auVar138._16_4_ = 0xff800000;
            auVar138._20_4_ = 0xff800000;
            auVar138._24_4_ = 0xff800000;
            auVar138._28_4_ = 0xff800000;
            auVar160._8_4_ = 0x7f800000;
            auVar160._0_8_ = 0x7f8000007f800000;
            auVar160._12_4_ = 0x7f800000;
            auVar160._16_4_ = 0x7f800000;
            auVar160._20_4_ = 0x7f800000;
            auVar160._24_4_ = 0x7f800000;
            auVar160._28_4_ = 0x7f800000;
            auVar90 = vblendvps_avx(auVar160,auVar138,auVar127);
            auVar145 = vpmovsxwd_avx(auVar226);
            auVar226 = vpunpckhwd_avx(auVar226,auVar226);
            auVar363._16_16_ = auVar226;
            auVar363._0_16_ = auVar145;
            auVar292 = vblendvps_avx(auVar292,auVar90,auVar363);
            auVar90 = vblendvps_avx(auVar138,auVar160,auVar127);
            auVar320 = vblendvps_avx(auVar320,auVar90,auVar363);
            auVar190._0_8_ = auVar362._0_8_ ^ 0xffffffffffffffff;
            auVar190._8_4_ = auVar362._8_4_ ^ 0xffffffff;
            auVar190._12_4_ = auVar362._12_4_ ^ 0xffffffff;
            auVar190._16_4_ = auVar362._16_4_ ^ 0xffffffff;
            auVar190._20_4_ = auVar362._20_4_ ^ 0xffffffff;
            auVar190._24_4_ = auVar362._24_4_ ^ 0xffffffff;
            auVar190._28_4_ = auVar362._28_4_ ^ 0xffffffff;
            auVar362 = vorps_avx(auVar127,auVar190);
            auVar362 = vandps_avx(auVar89,auVar362);
          }
          auVar365 = local_9c0._0_28_;
        }
        _local_4e0 = local_860;
        local_4c0 = vminps_avx(local_480,auVar292);
        auVar90 = vmaxps_avx(local_860,auVar320);
        _local_4a0 = auVar90;
        auVar89 = vcmpps_avx(local_860,local_4c0,2);
        local_b80 = vandps_avx(auVar88,auVar89);
        auVar89 = vcmpps_avx(auVar90,local_480,2);
        local_8e0 = vandps_avx(auVar88,auVar89);
        auVar88 = vorps_avx(local_b80,local_8e0);
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0x7f,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0xbf,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar88[0x1f] < '\0') {
          auVar128._0_8_ = auVar362._0_8_ ^ 0xffffffffffffffff;
          auVar128._8_4_ = auVar362._8_4_ ^ 0xffffffff;
          auVar128._12_4_ = auVar362._12_4_ ^ 0xffffffff;
          auVar128._16_4_ = auVar362._16_4_ ^ 0xffffffff;
          auVar128._20_4_ = auVar362._20_4_ ^ 0xffffffff;
          auVar128._24_4_ = auVar362._24_4_ ^ 0xffffffff;
          fVar223 = auVar362._28_4_;
          auVar128._28_4_ = (uint)fVar223 ^ 0xffffffff;
          auVar96._0_4_ =
               (float)local_820._0_4_ * auVar207._0_4_ +
               (float)local_840._0_4_ * auVar260._0_4_ + (float)local_900._0_4_ * auVar233._0_4_;
          auVar96._4_4_ =
               (float)local_820._4_4_ * auVar207._4_4_ +
               (float)local_840._4_4_ * auVar260._4_4_ + (float)local_900._4_4_ * auVar233._4_4_;
          auVar96._8_4_ =
               fStack_818 * auVar207._8_4_ +
               fStack_838 * auVar260._8_4_ + fStack_8f8 * auVar233._8_4_;
          auVar96._12_4_ =
               fStack_814 * auVar207._12_4_ +
               fStack_834 * auVar260._12_4_ + fStack_8f4 * auVar233._12_4_;
          auVar96._16_4_ =
               fStack_810 * auVar207._16_4_ +
               fStack_830 * auVar260._16_4_ + fStack_8f0 * auVar233._16_4_;
          auVar96._20_4_ =
               fStack_80c * auVar207._20_4_ +
               fStack_82c * auVar260._20_4_ + fStack_8ec * auVar233._20_4_;
          auVar96._24_4_ =
               fStack_808 * auVar207._24_4_ +
               fStack_828 * auVar260._24_4_ + fStack_8e8 * auVar233._24_4_;
          auVar96._28_4_ = fVar223 + local_8e0._28_4_ + auVar88._28_4_;
          auVar213._8_4_ = 0x7fffffff;
          auVar213._0_8_ = 0x7fffffff7fffffff;
          auVar213._12_4_ = 0x7fffffff;
          auVar213._16_4_ = 0x7fffffff;
          auVar213._20_4_ = 0x7fffffff;
          auVar213._24_4_ = 0x7fffffff;
          auVar213._28_4_ = 0x7fffffff;
          auVar88 = vandps_avx(auVar96,auVar213);
          auVar241._8_4_ = 0x3e99999a;
          auVar241._0_8_ = 0x3e99999a3e99999a;
          auVar241._12_4_ = 0x3e99999a;
          auVar241._16_4_ = 0x3e99999a;
          auVar241._20_4_ = 0x3e99999a;
          auVar241._24_4_ = 0x3e99999a;
          auVar241._28_4_ = 0x3e99999a;
          auVar88 = vcmpps_avx(auVar88,auVar241,1);
          local_7c0 = vorps_avx(auVar88,auVar128);
          auVar97._0_4_ =
               auVar365._0_4_ * (float)local_820._0_4_ +
               (float)local_840._0_4_ * (float)local_b40._0_4_ +
               (float)local_900._0_4_ * (float)local_b60._0_4_;
          auVar97._4_4_ =
               auVar365._4_4_ * (float)local_820._4_4_ +
               (float)local_840._4_4_ * (float)local_b40._4_4_ +
               (float)local_900._4_4_ * (float)local_b60._4_4_;
          auVar97._8_4_ =
               auVar365._8_4_ * fStack_818 + fStack_838 * fStack_b38 + fStack_8f8 * fStack_b58;
          auVar97._12_4_ =
               auVar365._12_4_ * fStack_814 + fStack_834 * fStack_b34 + fStack_8f4 * fStack_b54;
          auVar97._16_4_ =
               auVar365._16_4_ * fStack_810 + fStack_830 * fStack_b30 + fStack_8f0 * fStack_b50;
          auVar97._20_4_ =
               auVar365._20_4_ * fStack_80c + fStack_82c * fStack_b2c + fStack_8ec * fStack_b4c;
          auVar97._24_4_ =
               auVar365._24_4_ * fStack_808 + fStack_828 * fStack_b28 + fStack_8e8 * fStack_b48;
          auVar97._28_4_ = local_7c0._28_4_ + auVar90._28_4_ + fVar223;
          auVar88 = vandps_avx(auVar97,auVar213);
          auVar88 = vcmpps_avx(auVar88,auVar241,1);
          auVar88 = vorps_avx(auVar88,auVar128);
          auVar129._8_4_ = 3;
          auVar129._0_8_ = 0x300000003;
          auVar129._12_4_ = 3;
          auVar129._16_4_ = 3;
          auVar129._20_4_ = 3;
          auVar129._24_4_ = 3;
          auVar129._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar88 = vblendvps_avx(auVar156,auVar129,auVar88);
          local_ca0._0_4_ = auVar90._0_4_;
          local_ca0._4_4_ = auVar90._4_4_;
          fStack_c98 = auVar90._8_4_;
          fStack_c94 = auVar90._12_4_;
          fStack_c90 = auVar90._16_4_;
          fStack_c8c = auVar90._20_4_;
          fStack_c88 = auVar90._24_4_;
          local_7e0 = ZEXT432(local_d2c);
          local_800 = vpshufd_avx(ZEXT416(local_d2c),0);
          auVar226 = vpcmpgtd_avx(auVar88._16_16_,local_800);
          auVar145 = vpcmpgtd_avx(auVar88._0_16_,local_800);
          auVar130._16_16_ = auVar226;
          auVar130._0_16_ = auVar145;
          local_7a0 = vblendps_avx(ZEXT1632(auVar145),auVar130,0xf0);
          local_500 = vandnps_avx(local_7a0,local_b80);
          local_8a0._4_4_ = local_860._4_4_ + (float)local_920._4_4_;
          local_8a0._0_4_ = local_860._0_4_ + (float)local_920._0_4_;
          fStack_898 = local_860._8_4_ + fStack_918;
          fStack_894 = local_860._12_4_ + fStack_914;
          fStack_890 = local_860._16_4_ + fStack_910;
          fStack_88c = local_860._20_4_ + fStack_90c;
          fStack_888 = local_860._24_4_ + fStack_908;
          fStack_884 = local_860._28_4_ + fStack_904;
          auVar215 = ZEXT3264(local_b80);
          while( true ) {
            if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_500 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_500 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_500 >> 0x7f,0) == '\0') &&
                  (local_500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_500 >> 0xbf,0) == '\0') &&
                (local_500 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_500[0x1f]) break;
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar88 = vblendvps_avx(auVar131,local_860,local_500);
            auVar362 = vshufps_avx(auVar88,auVar88,0xb1);
            auVar362 = vminps_avx(auVar88,auVar362);
            auVar89 = vshufpd_avx(auVar362,auVar362,5);
            auVar362 = vminps_avx(auVar362,auVar89);
            auVar89 = vperm2f128_avx(auVar362,auVar362,1);
            auVar362 = vminps_avx(auVar362,auVar89);
            auVar362 = vcmpps_avx(auVar88,auVar362,0);
            auVar89 = local_500 & auVar362;
            auVar88 = local_500;
            if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar89 >> 0x7f,0) != '\0') ||
                  (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar89 >> 0xbf,0) != '\0') ||
                (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar89[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar362,local_500);
            }
            uVar65 = vmovmskps_avx(auVar88);
            uVar70 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar67 = (ulong)uVar70;
            *(undefined4 *)(local_500 + uVar67 * 4) = 0;
            fVar223 = local_1a0[uVar67];
            uVar70 = *(uint *)(local_4e0 + uVar67 * 4);
            fVar171 = auVar115._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar171 = sqrtf((float)local_a20._0_4_);
              uVar67 = extraout_RAX;
            }
            auVar145 = vminps_avx(_local_b90,_local_bb0);
            auVar226 = vmaxps_avx(_local_b90,_local_bb0);
            auVar79 = vminps_avx(_local_ba0,_local_bc0);
            auVar82 = vminps_avx(auVar145,auVar79);
            auVar145 = vmaxps_avx(_local_ba0,_local_bc0);
            auVar79 = vmaxps_avx(auVar226,auVar145);
            auVar175._8_4_ = 0x7fffffff;
            auVar175._0_8_ = 0x7fffffff7fffffff;
            auVar175._12_4_ = 0x7fffffff;
            auVar226 = vandps_avx(auVar82,auVar175);
            auVar145 = vandps_avx(auVar79,auVar175);
            auVar226 = vmaxps_avx(auVar226,auVar145);
            auVar145 = vmovshdup_avx(auVar226);
            auVar145 = vmaxss_avx(auVar145,auVar226);
            auVar226 = vshufpd_avx(auVar226,auVar226,1);
            auVar226 = vmaxss_avx(auVar226,auVar145);
            local_b40._0_4_ = auVar226._0_4_ * 1.9073486e-06;
            local_b20._0_4_ = fVar171 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar79,auVar79,0xff);
            auVar226 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar223),0x10);
            for (uVar74 = 0; bVar64 = (byte)uVar67, uVar74 != 5; uVar74 = uVar74 + 1) {
              auVar145 = vmovshdup_avx(auVar226);
              fVar196 = auVar145._0_4_;
              fVar191 = 1.0 - fVar196;
              auVar145 = vshufps_avx(auVar226,auVar226,0x55);
              fVar223 = auVar145._0_4_;
              fVar171 = auVar145._4_4_;
              fVar299 = auVar145._8_4_;
              fVar244 = auVar145._12_4_;
              auVar145 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
              fVar300 = auVar145._0_4_;
              fVar246 = auVar145._4_4_;
              fVar192 = auVar145._8_4_;
              fVar301 = auVar145._12_4_;
              fVar248 = (float)local_ba0._0_4_ * fVar223 + (float)local_bb0._0_4_ * fVar300;
              fVar193 = (float)local_ba0._4_4_ * fVar171 + (float)local_bb0._4_4_ * fVar246;
              fVar194 = fStack_b98 * fVar299 + fStack_ba8 * fVar192;
              fVar195 = fStack_b94 * fVar244 + fStack_ba4 * fVar301;
              auVar227._0_4_ =
                   fVar300 * ((float)local_bb0._0_4_ * fVar223 + fVar300 * (float)local_b90._0_4_) +
                   fVar223 * fVar248;
              auVar227._4_4_ =
                   fVar246 * ((float)local_bb0._4_4_ * fVar171 + fVar246 * (float)local_b90._4_4_) +
                   fVar171 * fVar193;
              auVar227._8_4_ =
                   fVar192 * (fStack_ba8 * fVar299 + fVar192 * fStack_b88) + fVar299 * fVar194;
              auVar227._12_4_ =
                   fVar301 * (fStack_ba4 * fVar244 + fVar301 * fStack_b84) + fVar244 * fVar195;
              auVar176._0_4_ =
                   fVar300 * fVar248 +
                   fVar223 * (fVar223 * (float)local_bc0._0_4_ + (float)local_ba0._0_4_ * fVar300);
              auVar176._4_4_ =
                   fVar246 * fVar193 +
                   fVar171 * (fVar171 * (float)local_bc0._4_4_ + (float)local_ba0._4_4_ * fVar246);
              auVar176._8_4_ =
                   fVar192 * fVar194 + fVar299 * (fVar299 * fStack_bb8 + fStack_b98 * fVar192);
              auVar176._12_4_ =
                   fVar301 * fVar195 + fVar244 * (fVar244 * fStack_bb4 + fStack_b94 * fVar301);
              auVar145 = vshufps_avx(auVar226,auVar226,0);
              auVar117._0_4_ = auVar145._0_4_ * (float)local_a10._0_4_ + 0.0;
              auVar117._4_4_ = auVar145._4_4_ * (float)local_a10._4_4_ + 0.0;
              auVar117._8_4_ = auVar145._8_4_ * fStack_a08 + 0.0;
              auVar117._12_4_ = auVar145._12_4_ * fStack_a04 + 0.0;
              auVar81._0_4_ = fVar300 * auVar227._0_4_ + fVar223 * auVar176._0_4_;
              auVar81._4_4_ = fVar246 * auVar227._4_4_ + fVar171 * auVar176._4_4_;
              auVar81._8_4_ = fVar192 * auVar227._8_4_ + fVar299 * auVar176._8_4_;
              auVar81._12_4_ = fVar301 * auVar227._12_4_ + fVar244 * auVar176._12_4_;
              local_9c0._0_16_ = auVar81;
              auVar145 = vsubps_avx(auVar117,auVar81);
              _local_b60 = auVar145;
              auVar145 = vdpps_avx(auVar145,auVar145,0x7f);
              fVar223 = auVar145._0_4_;
              if (fVar223 < 0.0) {
                local_a60._0_16_ = auVar176;
                fVar171 = sqrtf(fVar223);
                uVar67 = extraout_RAX_00;
                auVar176 = local_a60._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar145,auVar145);
                fVar171 = auVar79._0_4_;
              }
              auVar79 = vsubps_avx(auVar176,auVar227);
              auVar288._0_4_ = auVar79._0_4_ * 3.0;
              auVar288._4_4_ = auVar79._4_4_ * 3.0;
              auVar288._8_4_ = auVar79._8_4_ * 3.0;
              auVar288._12_4_ = auVar79._12_4_ * 3.0;
              auVar79 = vshufps_avx(ZEXT416((uint)(fVar196 * 6.0)),ZEXT416((uint)(fVar196 * 6.0)),0)
              ;
              auVar82 = ZEXT416((uint)((fVar191 - (fVar196 + fVar196)) * 6.0));
              auVar114 = vshufps_avx(auVar82,auVar82,0);
              auVar82 = ZEXT416((uint)((fVar196 - (fVar191 + fVar191)) * 6.0));
              auVar78 = vshufps_avx(auVar82,auVar82,0);
              auVar113 = vshufps_avx(ZEXT416((uint)(fVar191 * 6.0)),ZEXT416((uint)(fVar191 * 6.0)),0
                                    );
              auVar82 = vdpps_avx(auVar288,auVar288,0x7f);
              auVar118._0_4_ =
                   auVar113._0_4_ * (float)local_b90._0_4_ +
                   auVar78._0_4_ * (float)local_bb0._0_4_ +
                   auVar79._0_4_ * (float)local_bc0._0_4_ + auVar114._0_4_ * (float)local_ba0._0_4_;
              auVar118._4_4_ =
                   auVar113._4_4_ * (float)local_b90._4_4_ +
                   auVar78._4_4_ * (float)local_bb0._4_4_ +
                   auVar79._4_4_ * (float)local_bc0._4_4_ + auVar114._4_4_ * (float)local_ba0._4_4_;
              auVar118._8_4_ =
                   auVar113._8_4_ * fStack_b88 +
                   auVar78._8_4_ * fStack_ba8 +
                   auVar79._8_4_ * fStack_bb8 + auVar114._8_4_ * fStack_b98;
              auVar118._12_4_ =
                   auVar113._12_4_ * fStack_b84 +
                   auVar78._12_4_ * fStack_ba4 +
                   auVar79._12_4_ * fStack_bb4 + auVar114._12_4_ * fStack_b94;
              auVar79 = vblendps_avx(auVar82,_DAT_01f45a50,0xe);
              auVar114 = vrsqrtss_avx(auVar79,auVar79);
              fVar244 = auVar114._0_4_;
              fVar299 = auVar82._0_4_;
              auVar114 = vdpps_avx(auVar288,auVar118,0x7f);
              auVar78 = vshufps_avx(auVar82,auVar82,0);
              auVar119._0_4_ = auVar118._0_4_ * auVar78._0_4_;
              auVar119._4_4_ = auVar118._4_4_ * auVar78._4_4_;
              auVar119._8_4_ = auVar118._8_4_ * auVar78._8_4_;
              auVar119._12_4_ = auVar118._12_4_ * auVar78._12_4_;
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar203._0_4_ = auVar288._0_4_ * auVar114._0_4_;
              auVar203._4_4_ = auVar288._4_4_ * auVar114._4_4_;
              auVar203._8_4_ = auVar288._8_4_ * auVar114._8_4_;
              auVar203._12_4_ = auVar288._12_4_ * auVar114._12_4_;
              auVar113 = vsubps_avx(auVar119,auVar203);
              auVar114 = vrcpss_avx(auVar79,auVar79);
              auVar79 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                   ZEXT416((uint)(auVar226._0_4_ * (float)local_b20._0_4_)));
              auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar299 * auVar114._0_4_)));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              uVar59 = CONCAT44(auVar288._4_4_,auVar288._0_4_);
              auVar228._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar228._8_4_ = -auVar288._8_4_;
              auVar228._12_4_ = -auVar288._12_4_;
              auVar78 = ZEXT416((uint)(fVar244 * 1.5 + fVar299 * -0.5 * fVar244 * fVar244 * fVar244)
                               );
              auVar78 = vshufps_avx(auVar78,auVar78,0);
              auVar177._0_4_ = auVar78._0_4_ * auVar113._0_4_ * auVar114._0_4_;
              auVar177._4_4_ = auVar78._4_4_ * auVar113._4_4_ * auVar114._4_4_;
              auVar177._8_4_ = auVar78._8_4_ * auVar113._8_4_ * auVar114._8_4_;
              auVar177._12_4_ = auVar78._12_4_ * auVar113._12_4_ * auVar114._12_4_;
              auVar258._0_4_ = auVar288._0_4_ * auVar78._0_4_;
              auVar258._4_4_ = auVar288._4_4_ * auVar78._4_4_;
              auVar258._8_4_ = auVar288._8_4_ * auVar78._8_4_;
              auVar258._12_4_ = auVar288._12_4_ * auVar78._12_4_;
              if (fVar299 < 0.0) {
                local_a60._0_16_ = auVar228;
                local_a80._0_16_ = auVar258;
                local_aa0._0_16_ = auVar177;
                fVar299 = sqrtf(fVar299);
                uVar67 = extraout_RAX_01;
                auVar177 = local_aa0._0_16_;
                auVar228 = local_a60._0_16_;
                auVar258 = local_a80._0_16_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar299 = auVar82._0_4_;
              }
              auVar82 = vdpps_avx(_local_b60,auVar258,0x7f);
              fVar171 = ((float)local_b40._0_4_ / fVar299) * (fVar171 + 1.0) +
                        auVar79._0_4_ + fVar171 * (float)local_b40._0_4_;
              auVar114 = vdpps_avx(auVar228,auVar258,0x7f);
              auVar78 = vdpps_avx(_local_b60,auVar177,0x7f);
              auVar113 = vdpps_avx(_local_a10,auVar258,0x7f);
              auVar142 = vdpps_avx(_local_b60,auVar228,0x7f);
              fVar299 = auVar114._0_4_ + auVar78._0_4_;
              fVar244 = auVar82._0_4_;
              auVar83._0_4_ = fVar244 * fVar244;
              auVar83._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar83._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar83._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar78 = vsubps_avx(auVar145,auVar83);
              auVar114 = vdpps_avx(_local_b60,_local_a10,0x7f);
              fVar191 = auVar142._0_4_ - fVar244 * fVar299;
              fVar300 = auVar114._0_4_ - fVar244 * auVar113._0_4_;
              auVar114 = vrsqrtss_avx(auVar78,auVar78);
              fVar246 = auVar78._0_4_;
              fVar244 = auVar114._0_4_;
              fVar244 = fVar244 * 1.5 + fVar246 * -0.5 * fVar244 * fVar244 * fVar244;
              if (fVar246 < 0.0) {
                local_a60._0_4_ = fVar171;
                local_a80._0_16_ = auVar113;
                local_aa0._0_16_ = ZEXT416((uint)fVar299);
                local_980._0_4_ = fVar191;
                local_9e0._0_4_ = fVar300;
                local_a00._0_4_ = fVar244;
                fVar246 = sqrtf(fVar246);
                uVar67 = extraout_RAX_02;
                fVar244 = (float)local_a00._0_4_;
                fVar191 = (float)local_980._0_4_;
                fVar300 = (float)local_9e0._0_4_;
                auVar113 = local_a80._0_16_;
                fVar171 = (float)local_a60._0_4_;
                auVar114 = local_aa0._0_16_;
              }
              else {
                auVar114 = vsqrtss_avx(auVar78,auVar78);
                fVar246 = auVar114._0_4_;
                auVar114 = ZEXT416((uint)fVar299);
              }
              auVar142 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar112 = vshufps_avx(auVar288,auVar288,0xff);
              fVar299 = fVar191 * fVar244 - auVar112._0_4_;
              auVar204._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
              auVar204._8_4_ = auVar113._8_4_ ^ 0x80000000;
              auVar204._12_4_ = auVar113._12_4_ ^ 0x80000000;
              auVar229._0_4_ = -fVar299;
              auVar229._4_4_ = 0x80000000;
              auVar229._8_4_ = 0x80000000;
              auVar229._12_4_ = 0x80000000;
              auVar78 = vinsertps_avx(auVar229,ZEXT416((uint)(fVar300 * fVar244)),0x1c);
              auVar113 = vmovsldup_avx(ZEXT416((uint)(auVar114._0_4_ * fVar300 * fVar244 -
                                                     auVar113._0_4_ * fVar299)));
              auVar78 = vdivps_avx(auVar78,auVar113);
              auVar114 = vinsertps_avx(auVar114,auVar204,0x10);
              auVar114 = vdivps_avx(auVar114,auVar113);
              auVar113 = vmovsldup_avx(auVar82);
              auVar84 = ZEXT416((uint)(fVar246 - auVar142._0_4_));
              auVar142 = vmovsldup_avx(auVar84);
              auVar143._0_4_ = auVar113._0_4_ * auVar78._0_4_ + auVar142._0_4_ * auVar114._0_4_;
              auVar143._4_4_ = auVar113._4_4_ * auVar78._4_4_ + auVar142._4_4_ * auVar114._4_4_;
              auVar143._8_4_ = auVar113._8_4_ * auVar78._8_4_ + auVar142._8_4_ * auVar114._8_4_;
              auVar143._12_4_ = auVar113._12_4_ * auVar78._12_4_ + auVar142._12_4_ * auVar114._12_4_
              ;
              auVar226 = vsubps_avx(auVar226,auVar143);
              auVar144._8_4_ = 0x7fffffff;
              auVar144._0_8_ = 0x7fffffff7fffffff;
              auVar144._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar82,auVar144);
              if (auVar82._0_4_ < fVar171) {
                auVar178._8_4_ = 0x7fffffff;
                auVar178._0_8_ = 0x7fffffff7fffffff;
                auVar178._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx(auVar84,auVar178);
                if (auVar82._0_4_ < (float)local_880._0_4_ * 1.9073486e-06 + auVar79._0_4_ + fVar171
                   ) {
                  bVar75 = uVar74 < 5;
                  fVar171 = auVar226._0_4_ + (float)local_950._0_4_;
                  if (fVar171 < fVar294) {
                    bVar64 = 0;
                    goto LAB_0078b8b9;
                  }
                  fVar299 = *(float *)(ray + k * 4 + 0x100);
                  auVar215 = ZEXT3264(local_b80);
                  if (fVar171 <= fVar299) {
                    auVar79 = vmovshdup_avx(auVar226);
                    bVar64 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_0078b8cb;
                    auVar145 = vrsqrtss_avx(auVar145,auVar145);
                    fVar244 = auVar145._0_4_;
                    pGVar2 = (context->scene->geometries).items[local_ad8].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_0078b8cb;
                      auVar145 = ZEXT416((uint)(fVar244 * 1.5 +
                                               fVar223 * -0.5 * fVar244 * fVar244 * fVar244));
                      auVar145 = vshufps_avx(auVar145,auVar145,0);
                      auVar146._0_4_ = auVar145._0_4_ * (float)local_b60._0_4_;
                      auVar146._4_4_ = auVar145._4_4_ * (float)local_b60._4_4_;
                      auVar146._8_4_ = auVar145._8_4_ * fStack_b58;
                      auVar146._12_4_ = auVar145._12_4_ * fStack_b54;
                      auVar120._0_4_ = auVar288._0_4_ + auVar112._0_4_ * auVar146._0_4_;
                      auVar120._4_4_ = auVar288._4_4_ + auVar112._4_4_ * auVar146._4_4_;
                      auVar120._8_4_ = auVar288._8_4_ + auVar112._8_4_ * auVar146._8_4_;
                      auVar120._12_4_ = auVar288._12_4_ + auVar112._12_4_ * auVar146._12_4_;
                      auVar145 = vshufps_avx(auVar146,auVar146,0xc9);
                      auVar79 = vshufps_avx(auVar288,auVar288,0xc9);
                      auVar147._0_4_ = auVar79._0_4_ * auVar146._0_4_;
                      auVar147._4_4_ = auVar79._4_4_ * auVar146._4_4_;
                      auVar147._8_4_ = auVar79._8_4_ * auVar146._8_4_;
                      auVar147._12_4_ = auVar79._12_4_ * auVar146._12_4_;
                      auVar179._0_4_ = auVar288._0_4_ * auVar145._0_4_;
                      auVar179._4_4_ = auVar288._4_4_ * auVar145._4_4_;
                      auVar179._8_4_ = auVar288._8_4_ * auVar145._8_4_;
                      auVar179._12_4_ = auVar288._12_4_ * auVar145._12_4_;
                      auVar82 = vsubps_avx(auVar179,auVar147);
                      auVar145 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar79 = vshufps_avx(auVar120,auVar120,0xc9);
                      auVar180._0_4_ = auVar79._0_4_ * auVar145._0_4_;
                      auVar180._4_4_ = auVar79._4_4_ * auVar145._4_4_;
                      auVar180._8_4_ = auVar79._8_4_ * auVar145._8_4_;
                      auVar180._12_4_ = auVar79._12_4_ * auVar145._12_4_;
                      auVar145 = vshufps_avx(auVar82,auVar82,0xd2);
                      auVar121._0_4_ = auVar120._0_4_ * auVar145._0_4_;
                      auVar121._4_4_ = auVar120._4_4_ * auVar145._4_4_;
                      auVar121._8_4_ = auVar120._8_4_ * auVar145._8_4_;
                      auVar121._12_4_ = auVar120._12_4_ * auVar145._12_4_;
                      auVar145 = vsubps_avx(auVar180,auVar121);
                      pRVar3 = context->user;
                      local_700 = vshufps_avx(auVar226,auVar226,0x55);
                      auStack_750 = vshufps_avx(auVar145,auVar145,0x55);
                      local_740 = vshufps_avx(auVar145,auVar145,0xaa);
                      local_720 = vshufps_avx(auVar145,auVar145,0);
                      local_760 = (RTCHitN  [16])auStack_750;
                      local_6e0 = ZEXT832(0) << 0x20;
                      local_6c0 = local_600._0_8_;
                      uStack_6b8 = local_600._8_8_;
                      uStack_6b0 = local_600._16_8_;
                      uStack_6a8 = local_600._24_8_;
                      local_6a0 = local_5e0;
                      auVar88 = vcmpps_avx(local_5e0,local_5e0,0xf);
                      local_ae0[1] = auVar88;
                      *local_ae0 = auVar88;
                      local_680 = pRVar3->instID[0];
                      local_660 = pRVar3->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar171;
                      local_be0 = *local_ae8;
                      local_bd0 = *local_af0;
                      local_ad0.valid = (int *)local_be0;
                      local_ad0.geometryUserPtr = pGVar2->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_760;
                      local_ad0.N = 8;
                      local_ad0.ray = (RTCRayN *)ray;
                      local_730 = local_740;
                      local_710 = local_720;
                      local_6f0 = local_700;
                      uStack_67c = local_680;
                      uStack_678 = local_680;
                      uStack_674 = local_680;
                      uStack_670 = local_680;
                      uStack_66c = local_680;
                      uStack_668 = local_680;
                      uStack_664 = local_680;
                      uStack_65c = local_660;
                      uStack_658 = local_660;
                      uStack_654 = local_660;
                      uStack_650 = local_660;
                      uStack_64c = local_660;
                      uStack_648 = local_660;
                      uStack_644 = local_660;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar2->occlusionFilterN)(&local_ad0);
                      }
                      auVar226 = vpcmpeqd_avx(local_be0,ZEXT816(0) << 0x40);
                      auVar145 = vpcmpeqd_avx(local_bd0,ZEXT816(0) << 0x40);
                      auVar157._16_16_ = auVar145;
                      auVar157._0_16_ = auVar226;
                      auVar88 = _DAT_01f7b020 & ~auVar157;
                      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar88 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar88 >> 0x7f,0) == '\0') &&
                            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar88 >> 0xbf,0) == '\0') &&
                          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar88[0x1f]) {
                        auVar215 = ZEXT3264(local_b80);
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var4)(&local_ad0);
                        }
                        auVar226 = vpcmpeqd_avx(local_be0,ZEXT816(0) << 0x40);
                        auVar145 = vpcmpeqd_avx(local_bd0,ZEXT816(0) << 0x40);
                        auVar98._16_16_ = auVar145;
                        auVar98._0_16_ = auVar226;
                        auVar132._8_4_ = 0xff800000;
                        auVar132._0_8_ = 0xff800000ff800000;
                        auVar132._12_4_ = 0xff800000;
                        auVar132._16_4_ = 0xff800000;
                        auVar132._20_4_ = 0xff800000;
                        auVar132._24_4_ = 0xff800000;
                        auVar132._28_4_ = 0xff800000;
                        auVar88 = vblendvps_avx(auVar132,*(undefined1 (*) [32])
                                                          (local_ad0.ray + 0x100),auVar98);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar88;
                        auVar88 = _DAT_01f7b020 & ~auVar98;
                        auVar215 = ZEXT3264(local_b80);
                        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar88 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar88 >> 0x7f,0) != '\0') ||
                              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar88 >> 0xbf,0) != '\0') ||
                            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar88[0x1f] < '\0') {
                          bVar64 = 1;
                          goto LAB_0078b8cb;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar299;
                      bVar64 = 0;
                      goto LAB_0078b8cb;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_0078b8cb;
                }
              }
            }
            bVar75 = false;
LAB_0078b8b9:
            auVar215 = ZEXT3264(local_b80);
LAB_0078b8cb:
            uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar297._4_4_ = uVar73;
            auVar297._0_4_ = uVar73;
            auVar297._8_4_ = uVar73;
            auVar297._12_4_ = uVar73;
            auVar297._16_4_ = uVar73;
            auVar297._20_4_ = uVar73;
            auVar297._24_4_ = uVar73;
            auVar297._28_4_ = uVar73;
            auVar364 = ZEXT3264(auVar297);
            bVar72 = bVar72 | bVar75 & bVar64;
            auVar88 = vcmpps_avx(_local_8a0,auVar297,2);
            local_500 = vandps_avx(auVar88,local_500);
          }
          auVar99._0_4_ = (float)local_920._0_4_ + (float)local_ca0._0_4_;
          auVar99._4_4_ = (float)local_920._4_4_ + (float)local_ca0._4_4_;
          auVar99._8_4_ = fStack_918 + fStack_c98;
          auVar99._12_4_ = fStack_914 + fStack_c94;
          auVar99._16_4_ = fStack_910 + fStack_c90;
          auVar99._20_4_ = fStack_90c + fStack_c8c;
          auVar99._24_4_ = fStack_908 + fStack_c88;
          auVar99._28_4_ = fStack_904 + auVar90._28_4_;
          auVar226 = vshufps_avx(auVar364._0_16_,auVar364._0_16_,0);
          auVar133._16_16_ = auVar226;
          auVar133._0_16_ = auVar226;
          auVar88 = vcmpps_avx(auVar99,auVar133,2);
          _local_8a0 = vandps_avx(auVar88,local_8e0);
          auVar100._8_4_ = 3;
          auVar100._0_8_ = 0x300000003;
          auVar100._12_4_ = 3;
          auVar100._16_4_ = 3;
          auVar100._20_4_ = 3;
          auVar100._24_4_ = 3;
          auVar100._28_4_ = 3;
          auVar134._8_4_ = 2;
          auVar134._0_8_ = 0x200000002;
          auVar134._12_4_ = 2;
          auVar134._16_4_ = 2;
          auVar134._20_4_ = 2;
          auVar134._24_4_ = 2;
          auVar134._28_4_ = 2;
          auVar88 = vblendvps_avx(auVar134,auVar100,local_7c0);
          auVar226 = vpcmpgtd_avx(auVar88._16_16_,local_800);
          auVar145 = vpshufd_avx(local_7e0._0_16_,0);
          auVar145 = vpcmpgtd_avx(auVar88._0_16_,auVar145);
          auVar135._16_16_ = auVar226;
          auVar135._0_16_ = auVar145;
          local_8e0 = vblendps_avx(ZEXT1632(auVar145),auVar135,0xf0);
          local_520 = vandnps_avx(local_8e0,_local_8a0);
          local_860 = _local_4a0;
          local_ca0._4_4_ = (float)local_920._4_4_ + (float)local_4a0._4_4_;
          local_ca0._0_4_ = (float)local_920._0_4_ + (float)local_4a0._0_4_;
          fStack_c98 = fStack_918 + fStack_498;
          fStack_c94 = fStack_914 + fStack_494;
          fStack_c90 = fStack_910 + fStack_490;
          fStack_c8c = fStack_90c + fStack_48c;
          fStack_c88 = fStack_908 + fStack_488;
          fStack_c84 = fStack_904 + fStack_484;
          auVar310 = ZEXT3264(local_a40);
          for (; (((((((local_520 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_520 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_520 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_520 >> 0x7f,0) != '\0') ||
                   (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_520 >> 0xbf,0) != '\0') ||
                 (local_520 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_520[0x1f] < '\0'; local_520 = vandps_avx(auVar88,local_520)) {
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar88 = vblendvps_avx(auVar136,local_860,local_520);
            auVar362 = vshufps_avx(auVar88,auVar88,0xb1);
            auVar362 = vminps_avx(auVar88,auVar362);
            auVar89 = vshufpd_avx(auVar362,auVar362,5);
            auVar362 = vminps_avx(auVar362,auVar89);
            auVar89 = vperm2f128_avx(auVar362,auVar362,1);
            auVar362 = vminps_avx(auVar362,auVar89);
            auVar362 = vcmpps_avx(auVar88,auVar362,0);
            auVar89 = local_520 & auVar362;
            auVar88 = local_520;
            if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar89 >> 0x7f,0) != '\0') ||
                  (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar89 >> 0xbf,0) != '\0') ||
                (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar89[0x1f] < '\0') {
              auVar88 = vandps_avx(auVar362,local_520);
            }
            uVar65 = vmovmskps_avx(auVar88);
            uVar70 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> uVar70 & 1) == 0; uVar70 = uVar70 + 1) {
              }
            }
            uVar67 = (ulong)uVar70;
            *(undefined4 *)(local_520 + uVar67 * 4) = 0;
            fVar223 = local_1c0[uVar67];
            uVar70 = *(uint *)(local_480 + uVar67 * 4);
            fVar171 = auVar10._0_4_;
            if ((float)local_a20._0_4_ < 0.0) {
              fVar171 = sqrtf((float)local_a20._0_4_);
              auVar310 = ZEXT3264(local_a40);
              uVar67 = extraout_RAX_03;
            }
            auVar145 = vminps_avx(_local_b90,_local_bb0);
            auVar226 = vmaxps_avx(_local_b90,_local_bb0);
            auVar79 = vminps_avx(_local_ba0,_local_bc0);
            auVar82 = vminps_avx(auVar145,auVar79);
            auVar145 = vmaxps_avx(_local_ba0,_local_bc0);
            auVar79 = vmaxps_avx(auVar226,auVar145);
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar226 = vandps_avx(auVar82,auVar181);
            auVar145 = vandps_avx(auVar79,auVar181);
            auVar226 = vmaxps_avx(auVar226,auVar145);
            auVar145 = vmovshdup_avx(auVar226);
            auVar145 = vmaxss_avx(auVar145,auVar226);
            auVar226 = vshufpd_avx(auVar226,auVar226,1);
            auVar226 = vmaxss_avx(auVar226,auVar145);
            local_b40._0_4_ = auVar226._0_4_ * 1.9073486e-06;
            local_a60._0_4_ = fVar171 * 1.9073486e-06;
            local_880._0_16_ = vshufps_avx(auVar79,auVar79,0xff);
            auVar226 = vinsertps_avx(ZEXT416(uVar70),ZEXT416((uint)fVar223),0x10);
            for (uVar74 = 0; bVar64 = (byte)uVar67, uVar74 != 5; uVar74 = uVar74 + 1) {
              auVar145 = vmovshdup_avx(auVar226);
              fVar196 = auVar145._0_4_;
              fVar191 = 1.0 - fVar196;
              auVar145 = vshufps_avx(auVar226,auVar226,0x55);
              fVar223 = auVar145._0_4_;
              fVar171 = auVar145._4_4_;
              fVar299 = auVar145._8_4_;
              fVar244 = auVar145._12_4_;
              auVar145 = vshufps_avx(ZEXT416((uint)fVar191),ZEXT416((uint)fVar191),0);
              fVar300 = auVar145._0_4_;
              fVar246 = auVar145._4_4_;
              fVar192 = auVar145._8_4_;
              fVar301 = auVar145._12_4_;
              fVar248 = (float)local_ba0._0_4_ * fVar223 + (float)local_bb0._0_4_ * fVar300;
              fVar193 = (float)local_ba0._4_4_ * fVar171 + (float)local_bb0._4_4_ * fVar246;
              fVar194 = fStack_b98 * fVar299 + fStack_ba8 * fVar192;
              fVar195 = fStack_b94 * fVar244 + fStack_ba4 * fVar301;
              auVar230._0_4_ =
                   fVar300 * ((float)local_bb0._0_4_ * fVar223 + fVar300 * (float)local_b90._0_4_) +
                   fVar223 * fVar248;
              auVar230._4_4_ =
                   fVar246 * ((float)local_bb0._4_4_ * fVar171 + fVar246 * (float)local_b90._4_4_) +
                   fVar171 * fVar193;
              auVar230._8_4_ =
                   fVar192 * (fStack_ba8 * fVar299 + fVar192 * fStack_b88) + fVar299 * fVar194;
              auVar230._12_4_ =
                   fVar301 * (fStack_ba4 * fVar244 + fVar301 * fStack_b84) + fVar244 * fVar195;
              auVar182._0_4_ =
                   fVar300 * fVar248 +
                   fVar223 * (fVar223 * (float)local_bc0._0_4_ + (float)local_ba0._0_4_ * fVar300);
              auVar182._4_4_ =
                   fVar246 * fVar193 +
                   fVar171 * (fVar171 * (float)local_bc0._4_4_ + (float)local_ba0._4_4_ * fVar246);
              auVar182._8_4_ =
                   fVar192 * fVar194 + fVar299 * (fVar299 * fStack_bb8 + fStack_b98 * fVar192);
              auVar182._12_4_ =
                   fVar301 * fVar195 + fVar244 * (fVar244 * fStack_bb4 + fStack_b94 * fVar301);
              auVar145 = vshufps_avx(auVar226,auVar226,0);
              auVar122._0_4_ = auVar145._0_4_ * (float)local_a10._0_4_ + 0.0;
              auVar122._4_4_ = auVar145._4_4_ * (float)local_a10._4_4_ + 0.0;
              auVar122._8_4_ = auVar145._8_4_ * fStack_a08 + 0.0;
              auVar122._12_4_ = auVar145._12_4_ * fStack_a04 + 0.0;
              auVar85._0_4_ = fVar300 * auVar230._0_4_ + fVar223 * auVar182._0_4_;
              auVar85._4_4_ = fVar246 * auVar230._4_4_ + fVar171 * auVar182._4_4_;
              auVar85._8_4_ = fVar192 * auVar230._8_4_ + fVar299 * auVar182._8_4_;
              auVar85._12_4_ = fVar301 * auVar230._12_4_ + fVar244 * auVar182._12_4_;
              local_9c0._0_16_ = auVar85;
              auVar145 = vsubps_avx(auVar122,auVar85);
              _local_b60 = auVar145;
              auVar145 = vdpps_avx(auVar145,auVar145,0x7f);
              fVar223 = auVar145._0_4_;
              if (fVar223 < 0.0) {
                local_b20._0_16_ = auVar230;
                fVar171 = sqrtf(fVar223);
                uVar67 = extraout_RAX_04;
                auVar230 = local_b20._0_16_;
              }
              else {
                auVar79 = vsqrtss_avx(auVar145,auVar145);
                fVar171 = auVar79._0_4_;
              }
              auVar79 = vsubps_avx(auVar182,auVar230);
              auVar289._0_4_ = auVar79._0_4_ * 3.0;
              auVar289._4_4_ = auVar79._4_4_ * 3.0;
              auVar289._8_4_ = auVar79._8_4_ * 3.0;
              auVar289._12_4_ = auVar79._12_4_ * 3.0;
              auVar79 = vshufps_avx(ZEXT416((uint)(fVar196 * 6.0)),ZEXT416((uint)(fVar196 * 6.0)),0)
              ;
              auVar82 = ZEXT416((uint)((fVar191 - (fVar196 + fVar196)) * 6.0));
              auVar114 = vshufps_avx(auVar82,auVar82,0);
              auVar82 = ZEXT416((uint)((fVar196 - (fVar191 + fVar191)) * 6.0));
              auVar78 = vshufps_avx(auVar82,auVar82,0);
              auVar113 = vshufps_avx(ZEXT416((uint)(fVar191 * 6.0)),ZEXT416((uint)(fVar191 * 6.0)),0
                                    );
              auVar82 = vdpps_avx(auVar289,auVar289,0x7f);
              auVar123._0_4_ =
                   auVar113._0_4_ * (float)local_b90._0_4_ +
                   auVar78._0_4_ * (float)local_bb0._0_4_ +
                   auVar79._0_4_ * (float)local_bc0._0_4_ + auVar114._0_4_ * (float)local_ba0._0_4_;
              auVar123._4_4_ =
                   auVar113._4_4_ * (float)local_b90._4_4_ +
                   auVar78._4_4_ * (float)local_bb0._4_4_ +
                   auVar79._4_4_ * (float)local_bc0._4_4_ + auVar114._4_4_ * (float)local_ba0._4_4_;
              auVar123._8_4_ =
                   auVar113._8_4_ * fStack_b88 +
                   auVar78._8_4_ * fStack_ba8 +
                   auVar79._8_4_ * fStack_bb8 + auVar114._8_4_ * fStack_b98;
              auVar123._12_4_ =
                   auVar113._12_4_ * fStack_b84 +
                   auVar78._12_4_ * fStack_ba4 +
                   auVar79._12_4_ * fStack_bb4 + auVar114._12_4_ * fStack_b94;
              auVar79 = vblendps_avx(auVar82,_DAT_01f45a50,0xe);
              auVar114 = vrsqrtss_avx(auVar79,auVar79);
              fVar244 = auVar114._0_4_;
              fVar299 = auVar82._0_4_;
              auVar114 = vdpps_avx(auVar289,auVar123,0x7f);
              auVar78 = vshufps_avx(auVar82,auVar82,0);
              auVar124._0_4_ = auVar123._0_4_ * auVar78._0_4_;
              auVar124._4_4_ = auVar123._4_4_ * auVar78._4_4_;
              auVar124._8_4_ = auVar123._8_4_ * auVar78._8_4_;
              auVar124._12_4_ = auVar123._12_4_ * auVar78._12_4_;
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              auVar205._0_4_ = auVar289._0_4_ * auVar114._0_4_;
              auVar205._4_4_ = auVar289._4_4_ * auVar114._4_4_;
              auVar205._8_4_ = auVar289._8_4_ * auVar114._8_4_;
              auVar205._12_4_ = auVar289._12_4_ * auVar114._12_4_;
              auVar113 = vsubps_avx(auVar124,auVar205);
              auVar114 = vrcpss_avx(auVar79,auVar79);
              auVar79 = vmaxss_avx(ZEXT416((uint)local_b40._0_4_),
                                   ZEXT416((uint)(auVar226._0_4_ * (float)local_a60._0_4_)));
              auVar114 = ZEXT416((uint)(auVar114._0_4_ * (2.0 - fVar299 * auVar114._0_4_)));
              auVar114 = vshufps_avx(auVar114,auVar114,0);
              uVar59 = CONCAT44(auVar289._4_4_,auVar289._0_4_);
              auVar231._0_8_ = uVar59 ^ 0x8000000080000000;
              auVar231._8_4_ = -auVar289._8_4_;
              auVar231._12_4_ = -auVar289._12_4_;
              auVar78 = ZEXT416((uint)(fVar244 * 1.5 + fVar299 * -0.5 * fVar244 * fVar244 * fVar244)
                               );
              auVar78 = vshufps_avx(auVar78,auVar78,0);
              auVar183._0_4_ = auVar78._0_4_ * auVar113._0_4_ * auVar114._0_4_;
              auVar183._4_4_ = auVar78._4_4_ * auVar113._4_4_ * auVar114._4_4_;
              auVar183._8_4_ = auVar78._8_4_ * auVar113._8_4_ * auVar114._8_4_;
              auVar183._12_4_ = auVar78._12_4_ * auVar113._12_4_ * auVar114._12_4_;
              auVar259._0_4_ = auVar289._0_4_ * auVar78._0_4_;
              auVar259._4_4_ = auVar289._4_4_ * auVar78._4_4_;
              auVar259._8_4_ = auVar289._8_4_ * auVar78._8_4_;
              auVar259._12_4_ = auVar289._12_4_ * auVar78._12_4_;
              if (fVar299 < 0.0) {
                local_b20._0_4_ = fVar171;
                local_a80._0_16_ = auVar259;
                local_aa0._0_16_ = auVar183;
                fVar299 = sqrtf(fVar299);
                uVar67 = extraout_RAX_05;
                auVar183 = local_aa0._0_16_;
                auVar259 = local_a80._0_16_;
                fVar171 = (float)local_b20._0_4_;
              }
              else {
                auVar82 = vsqrtss_avx(auVar82,auVar82);
                fVar299 = auVar82._0_4_;
              }
              auVar82 = vdpps_avx(_local_b60,auVar259,0x7f);
              local_b20._0_4_ =
                   ((float)local_b40._0_4_ / fVar299) * (fVar171 + 1.0) +
                   auVar79._0_4_ + fVar171 * (float)local_b40._0_4_;
              auVar114 = vdpps_avx(auVar231,auVar259,0x7f);
              auVar78 = vdpps_avx(_local_b60,auVar183,0x7f);
              auVar113 = vdpps_avx(_local_a10,auVar259,0x7f);
              auVar142 = vdpps_avx(_local_b60,auVar231,0x7f);
              fVar171 = auVar114._0_4_ + auVar78._0_4_;
              fVar299 = auVar82._0_4_;
              auVar86._0_4_ = fVar299 * fVar299;
              auVar86._4_4_ = auVar82._4_4_ * auVar82._4_4_;
              auVar86._8_4_ = auVar82._8_4_ * auVar82._8_4_;
              auVar86._12_4_ = auVar82._12_4_ * auVar82._12_4_;
              auVar78 = vsubps_avx(auVar145,auVar86);
              auVar114 = vdpps_avx(_local_b60,_local_a10,0x7f);
              fVar244 = auVar142._0_4_ - fVar299 * fVar171;
              fVar191 = auVar114._0_4_ - fVar299 * auVar113._0_4_;
              auVar114 = vrsqrtss_avx(auVar78,auVar78);
              fVar300 = auVar78._0_4_;
              fVar299 = auVar114._0_4_;
              fVar299 = fVar299 * 1.5 + fVar300 * -0.5 * fVar299 * fVar299 * fVar299;
              if (fVar300 < 0.0) {
                local_a80._0_16_ = auVar82;
                local_aa0._0_16_ = auVar113;
                local_980._0_4_ = fVar244;
                local_9e0._0_4_ = fVar191;
                local_a00._0_4_ = fVar299;
                fVar300 = sqrtf(fVar300);
                uVar67 = extraout_RAX_06;
                fVar299 = (float)local_a00._0_4_;
                fVar244 = (float)local_980._0_4_;
                fVar191 = (float)local_9e0._0_4_;
                auVar113 = local_aa0._0_16_;
                auVar82 = local_a80._0_16_;
              }
              else {
                auVar114 = vsqrtss_avx(auVar78,auVar78);
                fVar300 = auVar114._0_4_;
              }
              auVar310 = ZEXT3264(local_a40);
              auVar142 = vpermilps_avx(local_9c0._0_16_,0xff);
              auVar112 = vshufps_avx(auVar289,auVar289,0xff);
              fVar244 = fVar244 * fVar299 - auVar112._0_4_;
              auVar206._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
              auVar206._8_4_ = auVar113._8_4_ ^ 0x80000000;
              auVar206._12_4_ = auVar113._12_4_ ^ 0x80000000;
              auVar232._0_4_ = -fVar244;
              auVar232._4_4_ = 0x80000000;
              auVar232._8_4_ = 0x80000000;
              auVar232._12_4_ = 0x80000000;
              auVar114 = vinsertps_avx(auVar232,ZEXT416((uint)(fVar191 * fVar299)),0x1c);
              auVar113 = vmovsldup_avx(ZEXT416((uint)(fVar171 * fVar191 * fVar299 -
                                                     auVar113._0_4_ * fVar244)));
              auVar114 = vdivps_avx(auVar114,auVar113);
              auVar78 = vinsertps_avx(ZEXT416((uint)fVar171),auVar206,0x10);
              auVar78 = vdivps_avx(auVar78,auVar113);
              auVar113 = vmovsldup_avx(auVar82);
              auVar84 = ZEXT416((uint)(fVar300 - auVar142._0_4_));
              auVar142 = vmovsldup_avx(auVar84);
              auVar148._0_4_ = auVar113._0_4_ * auVar114._0_4_ + auVar142._0_4_ * auVar78._0_4_;
              auVar148._4_4_ = auVar113._4_4_ * auVar114._4_4_ + auVar142._4_4_ * auVar78._4_4_;
              auVar148._8_4_ = auVar113._8_4_ * auVar114._8_4_ + auVar142._8_4_ * auVar78._8_4_;
              auVar148._12_4_ = auVar113._12_4_ * auVar114._12_4_ + auVar142._12_4_ * auVar78._12_4_
              ;
              auVar226 = vsubps_avx(auVar226,auVar148);
              auVar149._8_4_ = 0x7fffffff;
              auVar149._0_8_ = 0x7fffffff7fffffff;
              auVar149._12_4_ = 0x7fffffff;
              auVar82 = vandps_avx(auVar82,auVar149);
              if (auVar82._0_4_ < (float)local_b20._0_4_) {
                auVar184._8_4_ = 0x7fffffff;
                auVar184._0_8_ = 0x7fffffff7fffffff;
                auVar184._12_4_ = 0x7fffffff;
                auVar82 = vandps_avx(auVar84,auVar184);
                if (auVar82._0_4_ <
                    (float)local_880._0_4_ * 1.9073486e-06 + auVar79._0_4_ + (float)local_b20._0_4_)
                {
                  bVar75 = uVar74 < 5;
                  fVar171 = auVar226._0_4_ + (float)local_950._0_4_;
                  if (fVar171 < fVar294) {
                    bVar64 = 0;
                    goto LAB_0078c3a8;
                  }
                  fVar299 = *(float *)(ray + k * 4 + 0x100);
                  auVar215 = ZEXT3264(local_b80);
                  if (fVar171 <= fVar299) {
                    auVar79 = vmovshdup_avx(auVar226);
                    bVar64 = 0;
                    if ((auVar79._0_4_ < 0.0) || (1.0 < auVar79._0_4_)) goto LAB_0078c3b1;
                    auVar145 = vrsqrtss_avx(auVar145,auVar145);
                    fVar244 = auVar145._0_4_;
                    pGVar2 = (context->scene->geometries).items[local_ad8].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_0078c3b1;
                      auVar145 = ZEXT416((uint)(fVar244 * 1.5 +
                                               fVar223 * -0.5 * fVar244 * fVar244 * fVar244));
                      auVar145 = vshufps_avx(auVar145,auVar145,0);
                      auVar150._0_4_ = auVar145._0_4_ * (float)local_b60._0_4_;
                      auVar150._4_4_ = auVar145._4_4_ * (float)local_b60._4_4_;
                      auVar150._8_4_ = auVar145._8_4_ * fStack_b58;
                      auVar150._12_4_ = auVar145._12_4_ * fStack_b54;
                      auVar125._0_4_ = auVar289._0_4_ + auVar112._0_4_ * auVar150._0_4_;
                      auVar125._4_4_ = auVar289._4_4_ + auVar112._4_4_ * auVar150._4_4_;
                      auVar125._8_4_ = auVar289._8_4_ + auVar112._8_4_ * auVar150._8_4_;
                      auVar125._12_4_ = auVar289._12_4_ + auVar112._12_4_ * auVar150._12_4_;
                      auVar145 = vshufps_avx(auVar150,auVar150,0xc9);
                      auVar79 = vshufps_avx(auVar289,auVar289,0xc9);
                      auVar151._0_4_ = auVar79._0_4_ * auVar150._0_4_;
                      auVar151._4_4_ = auVar79._4_4_ * auVar150._4_4_;
                      auVar151._8_4_ = auVar79._8_4_ * auVar150._8_4_;
                      auVar151._12_4_ = auVar79._12_4_ * auVar150._12_4_;
                      auVar185._0_4_ = auVar289._0_4_ * auVar145._0_4_;
                      auVar185._4_4_ = auVar289._4_4_ * auVar145._4_4_;
                      auVar185._8_4_ = auVar289._8_4_ * auVar145._8_4_;
                      auVar185._12_4_ = auVar289._12_4_ * auVar145._12_4_;
                      auVar82 = vsubps_avx(auVar185,auVar151);
                      auVar145 = vshufps_avx(auVar82,auVar82,0xc9);
                      auVar79 = vshufps_avx(auVar125,auVar125,0xc9);
                      auVar186._0_4_ = auVar79._0_4_ * auVar145._0_4_;
                      auVar186._4_4_ = auVar79._4_4_ * auVar145._4_4_;
                      auVar186._8_4_ = auVar79._8_4_ * auVar145._8_4_;
                      auVar186._12_4_ = auVar79._12_4_ * auVar145._12_4_;
                      auVar145 = vshufps_avx(auVar82,auVar82,0xd2);
                      auVar126._0_4_ = auVar125._0_4_ * auVar145._0_4_;
                      auVar126._4_4_ = auVar125._4_4_ * auVar145._4_4_;
                      auVar126._8_4_ = auVar125._8_4_ * auVar145._8_4_;
                      auVar126._12_4_ = auVar125._12_4_ * auVar145._12_4_;
                      auVar145 = vsubps_avx(auVar186,auVar126);
                      pRVar3 = context->user;
                      local_700 = vshufps_avx(auVar226,auVar226,0x55);
                      auStack_750 = vshufps_avx(auVar145,auVar145,0x55);
                      local_740 = vshufps_avx(auVar145,auVar145,0xaa);
                      local_720 = vshufps_avx(auVar145,auVar145,0);
                      local_760 = (RTCHitN  [16])auStack_750;
                      local_6e0 = ZEXT832(0) << 0x20;
                      local_6c0 = local_600._0_8_;
                      uStack_6b8 = local_600._8_8_;
                      uStack_6b0 = local_600._16_8_;
                      uStack_6a8 = local_600._24_8_;
                      local_6a0 = local_5e0;
                      auVar88 = vcmpps_avx(local_5e0,local_5e0,0xf);
                      local_ae0[1] = auVar88;
                      *local_ae0 = auVar88;
                      local_680 = pRVar3->instID[0];
                      local_660 = pRVar3->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar171;
                      local_be0 = *local_ae8;
                      local_bd0 = *local_af0;
                      local_ad0.valid = (int *)local_be0;
                      local_ad0.geometryUserPtr = pGVar2->userPtr;
                      local_ad0.context = context->user;
                      local_ad0.hit = local_760;
                      local_ad0.N = 8;
                      local_ad0.ray = (RTCRayN *)ray;
                      local_730 = local_740;
                      local_710 = local_720;
                      local_6f0 = local_700;
                      uStack_67c = local_680;
                      uStack_678 = local_680;
                      uStack_674 = local_680;
                      uStack_670 = local_680;
                      uStack_66c = local_680;
                      uStack_668 = local_680;
                      uStack_664 = local_680;
                      uStack_65c = local_660;
                      uStack_658 = local_660;
                      uStack_654 = local_660;
                      uStack_650 = local_660;
                      uStack_64c = local_660;
                      uStack_648 = local_660;
                      uStack_644 = local_660;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar2->occlusionFilterN)(&local_ad0);
                        auVar310 = ZEXT3264(local_a40);
                      }
                      auVar226 = vpcmpeqd_avx(local_be0,ZEXT816(0) << 0x40);
                      auVar145 = vpcmpeqd_avx(local_bd0,ZEXT816(0) << 0x40);
                      auVar158._16_16_ = auVar145;
                      auVar158._0_16_ = auVar226;
                      auVar88 = _DAT_01f7b020 & ~auVar158;
                      if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               ) && (auVar88 >> 0x5f & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) && SUB321(auVar88 >> 0x7f,0) == '\0') &&
                            (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar88 >> 0xbf,0) == '\0') &&
                          (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar88[0x1f]) {
                        auVar215 = ZEXT3264(local_b80);
                      }
                      else {
                        p_Var4 = context->args->filter;
                        if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var4)(&local_ad0);
                          auVar310 = ZEXT3264(local_a40);
                        }
                        auVar226 = vpcmpeqd_avx(local_be0,ZEXT816(0) << 0x40);
                        auVar145 = vpcmpeqd_avx(local_bd0,ZEXT816(0) << 0x40);
                        auVar101._16_16_ = auVar145;
                        auVar101._0_16_ = auVar226;
                        auVar137._8_4_ = 0xff800000;
                        auVar137._0_8_ = 0xff800000ff800000;
                        auVar137._12_4_ = 0xff800000;
                        auVar137._16_4_ = 0xff800000;
                        auVar137._20_4_ = 0xff800000;
                        auVar137._24_4_ = 0xff800000;
                        auVar137._28_4_ = 0xff800000;
                        auVar88 = vblendvps_avx(auVar137,*(undefined1 (*) [32])
                                                          (local_ad0.ray + 0x100),auVar101);
                        *(undefined1 (*) [32])(local_ad0.ray + 0x100) = auVar88;
                        auVar88 = _DAT_01f7b020 & ~auVar101;
                        auVar215 = ZEXT3264(local_b80);
                        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar88 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar88 >> 0x7f,0) != '\0') ||
                              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar88 >> 0xbf,0) != '\0') ||
                            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar88[0x1f] < '\0') {
                          bVar64 = 1;
                          goto LAB_0078c3b1;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar299;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_0078c3b1;
                }
              }
            }
            bVar75 = false;
LAB_0078c3a8:
            auVar215 = ZEXT3264(local_b80);
LAB_0078c3b1:
            uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar298._4_4_ = uVar73;
            auVar298._0_4_ = uVar73;
            auVar298._8_4_ = uVar73;
            auVar298._12_4_ = uVar73;
            auVar298._16_4_ = uVar73;
            auVar298._20_4_ = uVar73;
            auVar298._24_4_ = uVar73;
            auVar298._28_4_ = uVar73;
            auVar364 = ZEXT3264(auVar298);
            bVar72 = bVar72 | bVar75 & bVar64;
            auVar88 = vcmpps_avx(_local_ca0,auVar298,2);
          }
          auVar88 = vandps_avx(auVar215._0_32_,local_7a0);
          auVar362 = vandps_avx(local_8e0,_local_8a0);
          auVar159._0_4_ = (float)local_920._0_4_ + local_4e0._0_4_;
          auVar159._4_4_ = (float)local_920._4_4_ + local_4e0._4_4_;
          auVar159._8_4_ = fStack_918 + local_4e0._8_4_;
          auVar159._12_4_ = fStack_914 + local_4e0._12_4_;
          auVar159._16_4_ = fStack_910 + local_4e0._16_4_;
          auVar159._20_4_ = fStack_90c + local_4e0._20_4_;
          auVar159._24_4_ = fStack_908 + local_4e0._24_4_;
          auVar159._28_4_ = fStack_904 + local_4e0._28_4_;
          auVar226 = vshufps_avx(auVar364._0_16_,auVar364._0_16_,0);
          auVar214._16_16_ = auVar226;
          auVar214._0_16_ = auVar226;
          auVar89 = vcmpps_avx(auVar159,auVar214,2);
          auVar88 = vandps_avx(auVar89,auVar88);
          auVar242._0_4_ = (float)local_920._0_4_ + local_4a0._0_4_;
          auVar242._4_4_ = (float)local_920._4_4_ + local_4a0._4_4_;
          auVar242._8_4_ = fStack_918 + local_4a0._8_4_;
          auVar242._12_4_ = fStack_914 + local_4a0._12_4_;
          auVar242._16_4_ = fStack_910 + local_4a0._16_4_;
          auVar242._20_4_ = fStack_90c + local_4a0._20_4_;
          auVar242._24_4_ = fStack_908 + local_4a0._24_4_;
          auVar242._28_4_ = fStack_904 + local_4a0._28_4_;
          auVar89 = vcmpps_avx(auVar242,auVar214,2);
          auVar362 = vandps_avx(auVar89,auVar362);
          auVar362 = vorps_avx(auVar88,auVar362);
          if ((((((((auVar362 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar362 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar362 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar362 >> 0x7f,0) != '\0') ||
                (auVar362 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar362 >> 0xbf,0) != '\0') ||
              (auVar362 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar362[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar71 * 0x60) = auVar362;
            auVar88 = vblendvps_avx(_local_4a0,_local_4e0,auVar88);
            *(undefined1 (*) [32])(auStack_160 + uVar71 * 0x60) = auVar88;
            uVar67 = vmovlps_avx(local_770);
            (&uStack_140)[uVar71 * 0xc] = uVar67;
            auStack_138[uVar71 * 0x18] = local_d2c + 1;
            uVar71 = (ulong)((int)uVar71 + 1);
          }
          auVar215 = ZEXT3264(local_8c0);
          auVar364 = ZEXT3264(local_9a0);
          fVar164 = (float)local_920._0_4_;
          fVar166 = (float)local_920._4_4_;
          fVar169 = fStack_918;
          fVar163 = fStack_914;
          fVar165 = fStack_910;
          fVar167 = fStack_90c;
          fVar170 = fStack_908;
          fVar255 = fStack_904;
          goto LAB_0078b006;
        }
      }
      auVar310 = ZEXT3264(local_a40);
      auVar215 = ZEXT3264(local_8c0);
      auVar364 = ZEXT3264(local_9a0);
    }
LAB_0078b006:
    while( true ) {
      uVar70 = (uint)uVar71;
      if (uVar70 == 0) {
        if (bVar72 != 0) goto LAB_0078c97a;
        uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar87._4_4_ = uVar73;
        auVar87._0_4_ = uVar73;
        auVar87._8_4_ = uVar73;
        auVar87._12_4_ = uVar73;
        auVar115 = vcmpps_avx(local_780,auVar87,2);
        uVar70 = vmovmskps_avx(auVar115);
        local_928 = (ulong)((uint)local_930 & uVar70);
        goto LAB_00789f00;
      }
      uVar71 = (ulong)(uVar70 - 1);
      lVar66 = uVar71 * 0x60;
      auVar88 = *(undefined1 (*) [32])(auStack_160 + lVar66);
      auVar95._0_4_ = fVar164 + auVar88._0_4_;
      auVar95._4_4_ = fVar166 + auVar88._4_4_;
      auVar95._8_4_ = fVar169 + auVar88._8_4_;
      auVar95._12_4_ = fVar163 + auVar88._12_4_;
      auVar95._16_4_ = fVar165 + auVar88._16_4_;
      auVar95._20_4_ = fVar167 + auVar88._20_4_;
      auVar95._24_4_ = fVar170 + auVar88._24_4_;
      auVar95._28_4_ = fVar255 + auVar88._28_4_;
      uVar73 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar189._4_4_ = uVar73;
      auVar189._0_4_ = uVar73;
      auVar189._8_4_ = uVar73;
      auVar189._12_4_ = uVar73;
      auVar189._16_4_ = uVar73;
      auVar189._20_4_ = uVar73;
      auVar189._24_4_ = uVar73;
      auVar189._28_4_ = uVar73;
      auVar362 = vcmpps_avx(auVar95,auVar189,2);
      _local_760 = vandps_avx(auVar362,*(undefined1 (*) [32])(auStack_180 + lVar66));
      auVar362 = *(undefined1 (*) [32])(auStack_180 + lVar66) & auVar362;
      if ((((((((auVar362 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar362 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar362 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar362 >> 0x7f,0) != '\0') ||
            (auVar362 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar362 >> 0xbf,0) != '\0') ||
          (auVar362 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar362[0x1f] < '\0') break;
      uVar71 = (ulong)(uVar70 - 1);
    }
    auVar155._8_4_ = 0x7f800000;
    auVar155._0_8_ = 0x7f8000007f800000;
    auVar155._12_4_ = 0x7f800000;
    auVar155._16_4_ = 0x7f800000;
    auVar155._20_4_ = 0x7f800000;
    auVar155._24_4_ = 0x7f800000;
    auVar155._28_4_ = 0x7f800000;
    auVar88 = vblendvps_avx(auVar155,auVar88,_local_760);
    auVar362 = vshufps_avx(auVar88,auVar88,0xb1);
    auVar362 = vminps_avx(auVar88,auVar362);
    auVar89 = vshufpd_avx(auVar362,auVar362,5);
    auVar362 = vminps_avx(auVar362,auVar89);
    auVar89 = vperm2f128_avx(auVar362,auVar362,1);
    auVar362 = vminps_avx(auVar362,auVar89);
    auVar89 = vcmpps_avx(auVar88,auVar362,0);
    auVar362 = auVar364._0_32_;
    auVar90 = _local_760 & auVar89;
    auVar88 = _local_760;
    if ((((((((auVar90 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar90 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar90 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar90 >> 0x7f,0) != '\0') ||
          (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar90 >> 0xbf,0) != '\0') ||
        (auVar90 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar90[0x1f] < '\0')
    {
      auVar88 = vandps_avx(auVar89,_local_760);
    }
    auVar116._8_8_ = 0;
    auVar116._0_8_ = (&uStack_140)[uVar71 * 0xc];
    local_d2c = auStack_138[uVar71 * 0x18];
    uVar68 = vmovmskps_avx(auVar88);
    uVar65 = 0;
    if (uVar68 != 0) {
      for (; (uVar68 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar65 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar66) = _local_760;
    uVar68 = uVar70 - 1;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar68 = uVar70;
    }
    auVar226 = vshufps_avx(auVar116,auVar116,0);
    auVar145 = vshufps_avx(auVar116,auVar116,0x55);
    auVar145 = vsubps_avx(auVar145,auVar226);
    local_4e0._4_4_ = auVar226._4_4_ + auVar145._4_4_ * 0.14285715;
    local_4e0._0_4_ = auVar226._0_4_ + auVar145._0_4_ * 0.0;
    fStack_4d8 = auVar226._8_4_ + auVar145._8_4_ * 0.2857143;
    fStack_4d4 = auVar226._12_4_ + auVar145._12_4_ * 0.42857146;
    fStack_4d0 = auVar226._0_4_ + auVar145._0_4_ * 0.5714286;
    fStack_4cc = auVar226._4_4_ + auVar145._4_4_ * 0.71428573;
    fStack_4c8 = auVar226._8_4_ + auVar145._8_4_ * 0.8571429;
    fStack_4c4 = auVar226._12_4_ + auVar145._12_4_;
    local_770._8_8_ = 0;
    local_770._0_8_ = *(ulong *)(local_4e0 + (ulong)uVar65 * 4);
    uVar71 = (ulong)uVar68;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }